

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCRayQueryContext *pRVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [12];
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  byte bVar73;
  byte bVar74;
  byte bVar75;
  ulong uVar76;
  byte bVar77;
  ulong uVar78;
  byte bVar79;
  byte bVar80;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar81;
  long lVar82;
  bool bVar83;
  ulong uVar84;
  uint uVar85;
  uint uVar144;
  uint uVar145;
  uint uVar147;
  uint uVar148;
  uint uVar149;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  uint uVar146;
  uint uVar150;
  undefined1 auVar137 [32];
  undefined1 auVar95 [16];
  undefined1 auVar138 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar143 [32];
  float pp;
  float fVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar171;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  float fVar213;
  float fVar214;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [64];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  float fVar240;
  float fVar242;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar241;
  float fVar243;
  float fVar245;
  undefined1 auVar238 [16];
  float fVar244;
  float fVar246;
  float fVar247;
  undefined1 auVar239 [32];
  float fVar248;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined4 uVar251;
  float fVar252;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_9e0 [16];
  RTCFilterFunctionNArguments local_930;
  undefined1 local_900 [16];
  undefined1 (*local_8e8) [32];
  Primitive *local_8e0;
  ulong local_8d8;
  ulong local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  float local_800;
  float fStack_7fc;
  float fStack_7f8;
  float fStack_7f4;
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [16];
  ulong local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  RTCHitN local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  uint local_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  uint uStack_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  undefined8 uStack_140;
  float afStack_138 [66];
  undefined1 auVar139 [32];
  undefined1 auVar142 [32];
  
  PVar1 = prim[1];
  uVar78 = (ulong)(byte)PVar1;
  fVar214 = *(float *)(prim + uVar78 * 0x19 + 0x12);
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar94 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar231 = vsubps_avx(auVar88,*(undefined1 (*) [16])(prim + uVar78 * 0x19 + 6));
  fVar213 = fVar214 * auVar231._0_4_;
  fVar151 = fVar214 * auVar94._0_4_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar78 * 4 + 6);
  auVar101 = vpmovsxbd_avx2(auVar88);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar78 * 5 + 6);
  auVar99 = vpmovsxbd_avx2(auVar13);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar78 * 6 + 6);
  auVar102 = vpmovsxbd_avx2(auVar86);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar78 * 0xb + 6);
  auVar103 = vpmovsxbd_avx2(auVar89);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar108 = vpmovsxbd_avx2(auVar90);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar104 = vcvtdq2ps_avx(auVar108);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar78 + 6);
  auVar100 = vpmovsxbd_avx2(auVar91);
  auVar100 = vcvtdq2ps_avx(auVar100);
  uVar84 = (ulong)(uint)((int)(uVar78 * 9) * 2);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar84 + 6);
  auVar105 = vpmovsxbd_avx2(auVar92);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar84 + uVar78 + 6);
  auVar106 = vpmovsxbd_avx2(auVar87);
  auVar106 = vcvtdq2ps_avx(auVar106);
  uVar76 = (ulong)(uint)((int)(uVar78 * 5) << 2);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar76 + 6);
  auVar98 = vpmovsxbd_avx2(auVar93);
  auVar107 = vcvtdq2ps_avx(auVar98);
  auVar118._4_4_ = fVar151;
  auVar118._0_4_ = fVar151;
  auVar118._8_4_ = fVar151;
  auVar118._12_4_ = fVar151;
  auVar118._16_4_ = fVar151;
  auVar118._20_4_ = fVar151;
  auVar118._24_4_ = fVar151;
  auVar118._28_4_ = fVar151;
  auVar120._8_4_ = 1;
  auVar120._0_8_ = 0x100000001;
  auVar120._12_4_ = 1;
  auVar120._16_4_ = 1;
  auVar120._20_4_ = 1;
  auVar120._24_4_ = 1;
  auVar120._28_4_ = 1;
  auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar110 = ZEXT1632(CONCAT412(fVar214 * auVar94._12_4_,
                                CONCAT48(fVar214 * auVar94._8_4_,
                                         CONCAT44(fVar214 * auVar94._4_4_,fVar151))));
  auVar109 = vpermps_avx2(auVar120,auVar110);
  auVar97 = vpermps_avx512vl(auVar96,auVar110);
  fVar151 = auVar97._0_4_;
  fVar240 = auVar97._4_4_;
  auVar110._4_4_ = fVar240 * auVar102._4_4_;
  auVar110._0_4_ = fVar151 * auVar102._0_4_;
  fVar242 = auVar97._8_4_;
  auVar110._8_4_ = fVar242 * auVar102._8_4_;
  fVar244 = auVar97._12_4_;
  auVar110._12_4_ = fVar244 * auVar102._12_4_;
  fVar252 = auVar97._16_4_;
  auVar110._16_4_ = fVar252 * auVar102._16_4_;
  fVar246 = auVar97._20_4_;
  auVar110._20_4_ = fVar246 * auVar102._20_4_;
  fVar247 = auVar97._24_4_;
  auVar110._24_4_ = fVar247 * auVar102._24_4_;
  auVar110._28_4_ = auVar108._28_4_;
  auVar108._4_4_ = auVar100._4_4_ * fVar240;
  auVar108._0_4_ = auVar100._0_4_ * fVar151;
  auVar108._8_4_ = auVar100._8_4_ * fVar242;
  auVar108._12_4_ = auVar100._12_4_ * fVar244;
  auVar108._16_4_ = auVar100._16_4_ * fVar252;
  auVar108._20_4_ = auVar100._20_4_ * fVar246;
  auVar108._24_4_ = auVar100._24_4_ * fVar247;
  auVar108._28_4_ = auVar98._28_4_;
  auVar98._4_4_ = auVar107._4_4_ * fVar240;
  auVar98._0_4_ = auVar107._0_4_ * fVar151;
  auVar98._8_4_ = auVar107._8_4_ * fVar242;
  auVar98._12_4_ = auVar107._12_4_ * fVar244;
  auVar98._16_4_ = auVar107._16_4_ * fVar252;
  auVar98._20_4_ = auVar107._20_4_ * fVar246;
  auVar98._24_4_ = auVar107._24_4_ * fVar247;
  auVar98._28_4_ = auVar97._28_4_;
  auVar88 = vfmadd231ps_fma(auVar110,auVar109,auVar99);
  auVar13 = vfmadd231ps_fma(auVar108,auVar109,auVar104);
  auVar86 = vfmadd231ps_fma(auVar98,auVar106,auVar109);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar118,auVar101);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar118,auVar103);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar105,auVar118);
  auVar119._4_4_ = fVar213;
  auVar119._0_4_ = fVar213;
  auVar119._8_4_ = fVar213;
  auVar119._12_4_ = fVar213;
  auVar119._16_4_ = fVar213;
  auVar119._20_4_ = fVar213;
  auVar119._24_4_ = fVar213;
  auVar119._28_4_ = fVar213;
  auVar98 = ZEXT1632(CONCAT412(fVar214 * auVar231._12_4_,
                               CONCAT48(fVar214 * auVar231._8_4_,
                                        CONCAT44(fVar214 * auVar231._4_4_,fVar213))));
  auVar108 = vpermps_avx2(auVar120,auVar98);
  auVar98 = vpermps_avx512vl(auVar96,auVar98);
  fVar214 = auVar98._0_4_;
  fVar151 = auVar98._4_4_;
  auVar109._4_4_ = fVar151 * auVar102._4_4_;
  auVar109._0_4_ = fVar214 * auVar102._0_4_;
  fVar240 = auVar98._8_4_;
  auVar109._8_4_ = fVar240 * auVar102._8_4_;
  fVar242 = auVar98._12_4_;
  auVar109._12_4_ = fVar242 * auVar102._12_4_;
  fVar244 = auVar98._16_4_;
  auVar109._16_4_ = fVar244 * auVar102._16_4_;
  fVar252 = auVar98._20_4_;
  auVar109._20_4_ = fVar252 * auVar102._20_4_;
  fVar246 = auVar98._24_4_;
  auVar109._24_4_ = fVar246 * auVar102._24_4_;
  auVar109._28_4_ = 1;
  auVar96._4_4_ = auVar100._4_4_ * fVar151;
  auVar96._0_4_ = auVar100._0_4_ * fVar214;
  auVar96._8_4_ = auVar100._8_4_ * fVar240;
  auVar96._12_4_ = auVar100._12_4_ * fVar242;
  auVar96._16_4_ = auVar100._16_4_ * fVar244;
  auVar96._20_4_ = auVar100._20_4_ * fVar252;
  auVar96._24_4_ = auVar100._24_4_ * fVar246;
  auVar96._28_4_ = auVar102._28_4_;
  auVar100._4_4_ = auVar107._4_4_ * fVar151;
  auVar100._0_4_ = auVar107._0_4_ * fVar214;
  auVar100._8_4_ = auVar107._8_4_ * fVar240;
  auVar100._12_4_ = auVar107._12_4_ * fVar242;
  auVar100._16_4_ = auVar107._16_4_ * fVar244;
  auVar100._20_4_ = auVar107._20_4_ * fVar252;
  auVar100._24_4_ = auVar107._24_4_ * fVar246;
  auVar100._28_4_ = auVar98._28_4_;
  auVar89 = vfmadd231ps_fma(auVar109,auVar108,auVar99);
  auVar90 = vfmadd231ps_fma(auVar96,auVar108,auVar104);
  auVar91 = vfmadd231ps_fma(auVar100,auVar108,auVar106);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar119,auVar101);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar119,auVar103);
  auVar115._8_4_ = 0x7fffffff;
  auVar115._0_8_ = 0x7fffffff7fffffff;
  auVar115._12_4_ = 0x7fffffff;
  auVar115._16_4_ = 0x7fffffff;
  auVar115._20_4_ = 0x7fffffff;
  auVar115._24_4_ = 0x7fffffff;
  auVar115._28_4_ = 0x7fffffff;
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar119,auVar105);
  auVar101 = vandps_avx(ZEXT1632(auVar88),auVar115);
  auVar117._8_4_ = 0x219392ef;
  auVar117._0_8_ = 0x219392ef219392ef;
  auVar117._12_4_ = 0x219392ef;
  auVar117._16_4_ = 0x219392ef;
  auVar117._20_4_ = 0x219392ef;
  auVar117._24_4_ = 0x219392ef;
  auVar117._28_4_ = 0x219392ef;
  uVar84 = vcmpps_avx512vl(auVar101,auVar117,1);
  bVar6 = (bool)((byte)uVar84 & 1);
  auVar97._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar88._0_4_;
  bVar6 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar88._4_4_;
  bVar6 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar88._8_4_;
  bVar6 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar88._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar101 = vandps_avx(ZEXT1632(auVar13),auVar115);
  uVar84 = vcmpps_avx512vl(auVar101,auVar117,1);
  bVar6 = (bool)((byte)uVar84 & 1);
  auVar111._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar13._0_4_;
  bVar6 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar13._4_4_;
  bVar6 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar13._8_4_;
  bVar6 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar13._12_4_;
  auVar111._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar111._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar111._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar111._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar101 = vandps_avx(ZEXT1632(auVar86),auVar115);
  uVar84 = vcmpps_avx512vl(auVar101,auVar117,1);
  bVar6 = (bool)((byte)uVar84 & 1);
  auVar101._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar86._0_4_;
  bVar6 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar86._4_4_;
  bVar6 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar86._8_4_;
  bVar6 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar86._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar99 = vrcp14ps_avx512vl(auVar97);
  auVar116._8_4_ = 0x3f800000;
  auVar116._0_8_ = &DAT_3f8000003f800000;
  auVar116._12_4_ = 0x3f800000;
  auVar116._16_4_ = 0x3f800000;
  auVar116._20_4_ = 0x3f800000;
  auVar116._24_4_ = 0x3f800000;
  auVar116._28_4_ = 0x3f800000;
  auVar88 = vfnmadd213ps_fma(auVar97,auVar99,auVar116);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar111);
  auVar13 = vfnmadd213ps_fma(auVar111,auVar99,auVar116);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar101);
  auVar86 = vfnmadd213ps_fma(auVar101,auVar99,auVar116);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar99,auVar99);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 7 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar89));
  auVar105._4_4_ = auVar88._4_4_ * auVar101._4_4_;
  auVar105._0_4_ = auVar88._0_4_ * auVar101._0_4_;
  auVar105._8_4_ = auVar88._8_4_ * auVar101._8_4_;
  auVar105._12_4_ = auVar88._12_4_ * auVar101._12_4_;
  auVar105._16_4_ = auVar101._16_4_ * 0.0;
  auVar105._20_4_ = auVar101._20_4_ * 0.0;
  auVar105._24_4_ = auVar101._24_4_ * 0.0;
  auVar105._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 9 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar89));
  auVar100 = vpbroadcastd_avx512vl();
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar114._0_4_ = auVar88._0_4_ * auVar101._0_4_;
  auVar114._4_4_ = auVar88._4_4_ * auVar101._4_4_;
  auVar114._8_4_ = auVar88._8_4_ * auVar101._8_4_;
  auVar114._12_4_ = auVar88._12_4_ * auVar101._12_4_;
  auVar114._16_4_ = auVar101._16_4_ * 0.0;
  auVar114._20_4_ = auVar101._20_4_ * 0.0;
  auVar114._24_4_ = auVar101._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar1 * 0x10 + uVar78 * -2 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar90));
  auVar106._4_4_ = auVar13._4_4_ * auVar101._4_4_;
  auVar106._0_4_ = auVar13._0_4_ * auVar101._0_4_;
  auVar106._8_4_ = auVar13._8_4_ * auVar101._8_4_;
  auVar106._12_4_ = auVar13._12_4_ * auVar101._12_4_;
  auVar106._16_4_ = auVar101._16_4_ * 0.0;
  auVar106._20_4_ = auVar101._20_4_ * 0.0;
  auVar106._24_4_ = auVar101._24_4_ * 0.0;
  auVar106._28_4_ = auVar101._28_4_;
  auVar101 = vcvtdq2ps_avx(auVar99);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar90));
  auVar113._0_4_ = auVar13._0_4_ * auVar101._0_4_;
  auVar113._4_4_ = auVar13._4_4_ * auVar101._4_4_;
  auVar113._8_4_ = auVar13._8_4_ * auVar101._8_4_;
  auVar113._12_4_ = auVar13._12_4_ * auVar101._12_4_;
  auVar113._16_4_ = auVar101._16_4_ * 0.0;
  auVar113._20_4_ = auVar101._20_4_ * 0.0;
  auVar113._24_4_ = auVar101._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 + uVar78 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar91));
  auVar107._4_4_ = auVar101._4_4_ * auVar86._4_4_;
  auVar107._0_4_ = auVar101._0_4_ * auVar86._0_4_;
  auVar107._8_4_ = auVar101._8_4_ * auVar86._8_4_;
  auVar107._12_4_ = auVar101._12_4_ * auVar86._12_4_;
  auVar107._16_4_ = auVar101._16_4_ * 0.0;
  auVar107._20_4_ = auVar101._20_4_ * 0.0;
  auVar107._24_4_ = auVar101._24_4_ * 0.0;
  auVar107._28_4_ = auVar101._28_4_;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x17 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar91));
  auVar112._0_4_ = auVar86._0_4_ * auVar101._0_4_;
  auVar112._4_4_ = auVar86._4_4_ * auVar101._4_4_;
  auVar112._8_4_ = auVar86._8_4_ * auVar101._8_4_;
  auVar112._12_4_ = auVar86._12_4_ * auVar101._12_4_;
  auVar112._16_4_ = auVar101._16_4_ * 0.0;
  auVar112._20_4_ = auVar101._20_4_ * 0.0;
  auVar112._24_4_ = auVar101._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar101 = vpminsd_avx2(auVar105,auVar114);
  auVar99 = vpminsd_avx2(auVar106,auVar113);
  auVar101 = vmaxps_avx(auVar101,auVar99);
  auVar99 = vpminsd_avx2(auVar107,auVar112);
  uVar251 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar102._4_4_ = uVar251;
  auVar102._0_4_ = uVar251;
  auVar102._8_4_ = uVar251;
  auVar102._12_4_ = uVar251;
  auVar102._16_4_ = uVar251;
  auVar102._20_4_ = uVar251;
  auVar102._24_4_ = uVar251;
  auVar102._28_4_ = uVar251;
  auVar99 = vmaxps_avx512vl(auVar99,auVar102);
  auVar101 = vmaxps_avx(auVar101,auVar99);
  auVar99._8_4_ = 0x3f7ffffa;
  auVar99._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar99._12_4_ = 0x3f7ffffa;
  auVar99._16_4_ = 0x3f7ffffa;
  auVar99._20_4_ = 0x3f7ffffa;
  auVar99._24_4_ = 0x3f7ffffa;
  auVar99._28_4_ = 0x3f7ffffa;
  local_420 = vmulps_avx512vl(auVar101,auVar99);
  auVar101 = vpmaxsd_avx2(auVar105,auVar114);
  auVar99 = vpmaxsd_avx2(auVar106,auVar113);
  auVar101 = vminps_avx(auVar101,auVar99);
  auVar99 = vpmaxsd_avx2(auVar107,auVar112);
  uVar251 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar103._4_4_ = uVar251;
  auVar103._0_4_ = uVar251;
  auVar103._8_4_ = uVar251;
  auVar103._12_4_ = uVar251;
  auVar103._16_4_ = uVar251;
  auVar103._20_4_ = uVar251;
  auVar103._24_4_ = uVar251;
  auVar103._28_4_ = uVar251;
  auVar99 = vminps_avx512vl(auVar99,auVar103);
  auVar101 = vminps_avx(auVar101,auVar99);
  auVar104._8_4_ = 0x3f800003;
  auVar104._0_8_ = 0x3f8000033f800003;
  auVar104._12_4_ = 0x3f800003;
  auVar104._16_4_ = 0x3f800003;
  auVar104._20_4_ = 0x3f800003;
  auVar104._24_4_ = 0x3f800003;
  auVar104._28_4_ = 0x3f800003;
  auVar101 = vmulps_avx512vl(auVar101,auVar104);
  uVar17 = vpcmpgtd_avx512vl(auVar100,_DAT_0205a920);
  uVar15 = vcmpps_avx512vl(local_420,auVar101,2);
  if ((byte)((byte)uVar15 & (byte)uVar17) == 0) {
    return;
  }
  local_8d0 = (ulong)(byte)((byte)uVar15 & (byte)uVar17);
  local_8e8 = (undefined1 (*) [32])&local_4c0;
  local_640 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_8e0 = prim;
LAB_01d7905b:
  lVar82 = 0;
  for (uVar84 = local_8d0; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
    lVar82 = lVar82 + 1;
  }
  uVar81 = *(uint *)(prim + 2);
  local_8c8 = (ulong)*(uint *)(prim + lVar82 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar81].ptr;
  lVar82 = *(long *)&pGVar3[1].time_range.upper;
  uVar84 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           local_8c8 *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar88 = *(undefined1 (*) [16])(lVar82 + (long)pGVar3[1].intersectionFilterN * uVar84);
  auVar13 = *(undefined1 (*) [16])(lVar82 + (long)pGVar3[1].intersectionFilterN * (uVar84 + 1));
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar89 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar101 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  auVar99 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar86 = vunpcklps_avx512vl(auVar101._0_16_,auVar99._0_16_);
  local_8c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar258 = ZEXT3264(local_8c0);
  auVar93 = local_8c0._0_16_;
  local_850 = vinsertps_avx512f(auVar86,auVar93,0x28);
  auVar231._8_4_ = 0xbeaaaaab;
  auVar231._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar231._12_4_ = 0xbeaaaaab;
  auVar91 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar3[2].intersectionFilterN +
                              uVar84 * (long)pGVar3[2].pointQueryFunc),auVar88,auVar231);
  auVar90 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar3[2].intersectionFilterN +
                             (long)pGVar3[2].pointQueryFunc * (uVar84 + 1)),auVar13,auVar231);
  auVar232._0_4_ = auVar13._0_4_ + auVar88._0_4_ + auVar91._0_4_ + auVar90._0_4_;
  auVar232._4_4_ = auVar13._4_4_ + auVar88._4_4_ + auVar91._4_4_ + auVar90._4_4_;
  auVar232._8_4_ = auVar13._8_4_ + auVar88._8_4_ + auVar91._8_4_ + auVar90._8_4_;
  auVar232._12_4_ = auVar13._12_4_ + auVar88._12_4_ + auVar91._12_4_ + auVar90._12_4_;
  auVar94._8_4_ = 0x3e800000;
  auVar94._0_8_ = 0x3e8000003e800000;
  auVar94._12_4_ = 0x3e800000;
  auVar86 = vmulps_avx512vl(auVar232,auVar94);
  auVar86 = vsubps_avx(auVar86,auVar89);
  auVar86 = vdpps_avx(auVar86,local_850,0x7f);
  fVar214 = *(float *)(ray + k * 4 + 0x60);
  local_860 = vdpps_avx(local_850,local_850,0x7f);
  auVar95._4_12_ = ZEXT812(0) << 0x20;
  auVar95._0_4_ = local_860._0_4_;
  auVar87 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar95);
  auVar92 = vfnmadd213ss_fma(auVar87,local_860,ZEXT416(0x40000000));
  local_400 = auVar86._0_4_ * auVar87._0_4_ * auVar92._0_4_;
  auVar236._4_4_ = local_400;
  auVar236._0_4_ = local_400;
  auVar236._8_4_ = local_400;
  auVar236._12_4_ = local_400;
  fStack_6f0 = local_400;
  _local_700 = auVar236;
  fStack_6ec = local_400;
  fStack_6e8 = local_400;
  fStack_6e4 = local_400;
  auVar86 = vfmadd231ps_fma(auVar89,local_850,auVar236);
  auVar86 = vblendps_avx(auVar86,ZEXT816(0) << 0x40,8);
  auVar88 = vsubps_avx(auVar88,auVar86);
  auVar89 = vsubps_avx(auVar90,auVar86);
  auVar90 = vsubps_avx(auVar91,auVar86);
  auVar220 = ZEXT3264(_DAT_02020f20);
  auVar13 = vsubps_avx(auVar13,auVar86);
  local_1e0 = auVar88._0_4_;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  auVar122._8_4_ = 1;
  auVar122._0_8_ = 0x100000001;
  auVar122._12_4_ = 1;
  auVar122._16_4_ = 1;
  auVar122._20_4_ = 1;
  auVar122._24_4_ = 1;
  auVar122._28_4_ = 1;
  local_740 = ZEXT1632(auVar88);
  local_200 = vpermps_avx2(auVar122,local_740);
  auVar123._8_4_ = 2;
  auVar123._0_8_ = 0x200000002;
  auVar123._12_4_ = 2;
  auVar123._16_4_ = 2;
  auVar123._20_4_ = 2;
  auVar123._24_4_ = 2;
  auVar123._28_4_ = 2;
  local_220 = vpermps_avx2(auVar123,local_740);
  auVar124._8_4_ = 3;
  auVar124._0_8_ = 0x300000003;
  auVar124._12_4_ = 3;
  auVar124._16_4_ = 3;
  auVar124._20_4_ = 3;
  auVar124._24_4_ = 3;
  auVar124._28_4_ = 3;
  local_240 = vpermps_avx2(auVar124,local_740);
  local_260 = auVar90._0_4_;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_780 = ZEXT1632(auVar90);
  local_280 = vpermps_avx2(auVar122,local_780);
  local_2a0 = vpermps_avx2(auVar123,local_780);
  local_2c0 = vpermps_avx2(auVar124,local_780);
  local_2e0 = auVar89._0_4_;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_760 = ZEXT1632(auVar89);
  local_300 = vpermps_avx2(auVar122,local_760);
  local_320 = vpermps_avx2(auVar123,local_760);
  local_340 = vpermps_avx2(auVar124,local_760);
  uVar251 = auVar13._0_4_;
  local_360._4_4_ = uVar251;
  local_360._0_4_ = uVar251;
  fStack_358 = (float)uVar251;
  fStack_354 = (float)uVar251;
  fStack_350 = (float)uVar251;
  fStack_34c = (float)uVar251;
  fStack_348 = (float)uVar251;
  register0x0000131c = uVar251;
  auVar230 = ZEXT3264(_local_360);
  _local_7a0 = ZEXT1632(auVar13);
  _local_380 = vpermps_avx2(auVar122,_local_7a0);
  _local_3a0 = vpermps_avx2(auVar123,_local_7a0);
  _local_3c0 = vpermps_avx2(auVar124,_local_7a0);
  auVar88 = vmulss_avx512f(auVar93,auVar93);
  auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar99,auVar99);
  local_5c0 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar101);
  local_3e0._0_4_ = local_5c0._0_4_;
  local_3e0._4_4_ = local_3e0._0_4_;
  local_3e0._8_4_ = local_3e0._0_4_;
  local_3e0._12_4_ = local_3e0._0_4_;
  local_3e0._16_4_ = local_3e0._0_4_;
  local_3e0._20_4_ = local_3e0._0_4_;
  local_3e0._24_4_ = local_3e0._0_4_;
  local_3e0._28_4_ = local_3e0._0_4_;
  auVar121._8_4_ = 0x7fffffff;
  auVar121._0_8_ = 0x7fffffff7fffffff;
  auVar121._12_4_ = 0x7fffffff;
  auVar121._16_4_ = 0x7fffffff;
  auVar121._20_4_ = 0x7fffffff;
  auVar121._24_4_ = 0x7fffffff;
  auVar121._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_3e0,auVar121);
  local_810 = ZEXT416((uint)local_400);
  local_400 = fVar214 - local_400;
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_600 = vpbroadcastd_avx512vl();
  local_8d8 = 0;
  local_7a8 = 1;
  local_620 = vpbroadcastd_avx512vl();
  auVar88 = vsqrtss_avx(local_860,local_860);
  auVar13 = vsqrtss_avx(local_860,local_860);
  auVar211 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    local_900 = auVar211._0_16_;
    auVar86 = vmovshdup_avx(local_900);
    fVar240 = auVar211._0_4_;
    fVar151 = auVar86._0_4_ - fVar240;
    fVar252 = fVar151 * 0.04761905;
    auVar235._4_4_ = fVar240;
    auVar235._0_4_ = fVar240;
    auVar235._8_4_ = fVar240;
    auVar235._12_4_ = fVar240;
    auVar235._16_4_ = fVar240;
    auVar235._20_4_ = fVar240;
    auVar235._24_4_ = fVar240;
    auVar235._28_4_ = fVar240;
    local_880._4_4_ = fVar151;
    local_880._0_4_ = fVar151;
    local_880._8_4_ = fVar151;
    local_880._12_4_ = fVar151;
    local_880._16_4_ = fVar151;
    local_880._20_4_ = fVar151;
    local_880._24_4_ = fVar151;
    local_880._28_4_ = fVar151;
    auVar86 = vfmadd231ps_fma(auVar235,local_880,auVar220._0_32_);
    auVar160._8_4_ = 0x3f800000;
    auVar160._0_8_ = &DAT_3f8000003f800000;
    auVar160._12_4_ = 0x3f800000;
    auVar160._16_4_ = 0x3f800000;
    auVar160._20_4_ = 0x3f800000;
    auVar160._24_4_ = 0x3f800000;
    auVar160._28_4_ = 0x3f800000;
    auVar102 = vsubps_avx(auVar160,ZEXT1632(auVar86));
    auVar71._4_4_ = fStack_25c;
    auVar71._0_4_ = local_260;
    auVar71._8_4_ = fStack_258;
    auVar71._12_4_ = fStack_254;
    auVar71._16_4_ = fStack_250;
    auVar71._20_4_ = fStack_24c;
    auVar71._24_4_ = fStack_248;
    auVar71._28_4_ = fStack_244;
    fVar151 = auVar86._0_4_;
    auVar184._0_4_ = local_260 * fVar151;
    fVar240 = auVar86._4_4_;
    auVar184._4_4_ = fStack_25c * fVar240;
    fVar242 = auVar86._8_4_;
    auVar184._8_4_ = fStack_258 * fVar242;
    fVar244 = auVar86._12_4_;
    auVar184._12_4_ = fStack_254 * fVar244;
    auVar184._16_4_ = fStack_250 * 0.0;
    auVar184._20_4_ = fStack_24c * 0.0;
    auVar184._24_4_ = fStack_248 * 0.0;
    auVar184._28_4_ = 0;
    auVar212._0_4_ = local_280._0_4_ * fVar151;
    auVar212._4_4_ = local_280._4_4_ * fVar240;
    auVar212._8_4_ = local_280._8_4_ * fVar242;
    auVar212._12_4_ = local_280._12_4_ * fVar244;
    auVar212._16_4_ = local_280._16_4_ * 0.0;
    auVar212._20_4_ = local_280._20_4_ * 0.0;
    auVar212._28_36_ = auVar211._28_36_;
    auVar212._24_4_ = local_280._24_4_ * 0.0;
    auVar211._0_4_ = local_2a0._0_4_ * fVar151;
    auVar211._4_4_ = local_2a0._4_4_ * fVar240;
    auVar211._8_4_ = local_2a0._8_4_ * fVar242;
    auVar211._12_4_ = local_2a0._12_4_ * fVar244;
    auVar211._16_4_ = local_2a0._16_4_ * 0.0;
    auVar211._20_4_ = local_2a0._20_4_ * 0.0;
    auVar211._28_36_ = auVar220._28_36_;
    auVar211._24_4_ = local_2a0._24_4_ * 0.0;
    auVar220._0_4_ = local_2c0._0_4_ * fVar151;
    auVar220._4_4_ = local_2c0._4_4_ * fVar240;
    auVar220._8_4_ = local_2c0._8_4_ * fVar242;
    auVar220._12_4_ = local_2c0._12_4_ * fVar244;
    auVar220._16_4_ = local_2c0._16_4_ * 0.0;
    auVar220._20_4_ = local_2c0._20_4_ * 0.0;
    auVar220._28_36_ = auVar230._28_36_;
    auVar220._24_4_ = local_2c0._24_4_ * 0.0;
    auVar72._4_4_ = uStack_1dc;
    auVar72._0_4_ = local_1e0;
    auVar72._8_4_ = uStack_1d8;
    auVar72._12_4_ = uStack_1d4;
    auVar72._16_4_ = uStack_1d0;
    auVar72._20_4_ = uStack_1cc;
    auVar72._24_4_ = uStack_1c8;
    auVar72._28_4_ = uStack_1c4;
    auVar89 = vfmadd231ps_fma(auVar184,auVar102,auVar72);
    auVar90 = vfmadd231ps_fma(auVar212._0_32_,auVar102,local_200);
    auVar91 = vfmadd231ps_fma(auVar211._0_32_,auVar102,local_220);
    auVar92 = vfmadd231ps_fma(auVar220._0_32_,auVar102,local_240);
    auVar70._4_4_ = uStack_2dc;
    auVar70._0_4_ = local_2e0;
    auVar70._8_4_ = uStack_2d8;
    auVar70._12_4_ = uStack_2d4;
    auVar70._16_4_ = uStack_2d0;
    auVar70._20_4_ = uStack_2cc;
    auVar70._24_4_ = uStack_2c8;
    auVar70._28_4_ = uStack_2c4;
    auVar103 = vmulps_avx512vl(auVar70,ZEXT1632(auVar86));
    auVar98 = ZEXT1632(auVar86);
    auVar104 = vmulps_avx512vl(local_300,auVar98);
    auVar100 = vmulps_avx512vl(local_320,auVar98);
    auVar105 = vmulps_avx512vl(local_340,auVar98);
    auVar87 = vfmadd231ps_fma(auVar103,auVar102,auVar71);
    auVar93 = vfmadd231ps_fma(auVar104,auVar102,local_280);
    auVar94 = vfmadd231ps_fma(auVar100,auVar102,local_2a0);
    auVar231 = vfmadd231ps_fma(auVar105,auVar102,local_2c0);
    auVar37._4_4_ = fVar240 * (float)local_360._4_4_;
    auVar37._0_4_ = fVar151 * (float)local_360._0_4_;
    auVar37._8_4_ = fVar242 * fStack_358;
    auVar37._12_4_ = fVar244 * fStack_354;
    auVar37._16_4_ = fStack_350 * 0.0;
    auVar37._20_4_ = fStack_34c * 0.0;
    auVar37._24_4_ = fStack_348 * 0.0;
    auVar37._28_4_ = fStack_244;
    auVar38._4_4_ = fVar240 * (float)local_380._4_4_;
    auVar38._0_4_ = fVar151 * (float)local_380._0_4_;
    auVar38._8_4_ = fVar242 * fStack_378;
    auVar38._12_4_ = fVar244 * fStack_374;
    auVar38._16_4_ = fStack_370 * 0.0;
    auVar38._20_4_ = fStack_36c * 0.0;
    auVar38._24_4_ = fStack_368 * 0.0;
    auVar38._28_4_ = local_280._28_4_;
    auVar39._4_4_ = fVar240 * (float)local_3a0._4_4_;
    auVar39._0_4_ = fVar151 * (float)local_3a0._0_4_;
    auVar39._8_4_ = fVar242 * fStack_398;
    auVar39._12_4_ = fVar244 * fStack_394;
    auVar39._16_4_ = fStack_390 * 0.0;
    auVar39._20_4_ = fStack_38c * 0.0;
    auVar39._24_4_ = fStack_388 * 0.0;
    auVar39._28_4_ = local_2a0._28_4_;
    auVar40._4_4_ = fVar240 * (float)local_3c0._4_4_;
    auVar40._0_4_ = fVar151 * (float)local_3c0._0_4_;
    auVar40._8_4_ = fVar242 * fStack_3b8;
    auVar40._12_4_ = fVar244 * fStack_3b4;
    auVar40._16_4_ = fStack_3b0 * 0.0;
    auVar40._20_4_ = fStack_3ac * 0.0;
    auVar40._24_4_ = fStack_3a8 * 0.0;
    auVar40._28_4_ = local_2c0._28_4_;
    auVar103 = vfmadd231ps_avx512vl(auVar37,auVar102,auVar70);
    auVar104 = vfmadd231ps_avx512vl(auVar38,auVar102,local_300);
    auVar100 = vfmadd231ps_avx512vl(auVar39,auVar102,local_320);
    auVar105 = vfmadd231ps_avx512vl(auVar40,auVar102,local_340);
    auVar106 = vmulps_avx512vl(auVar98,ZEXT1632(auVar87));
    auVar107 = vmulps_avx512vl(auVar98,ZEXT1632(auVar93));
    auVar108 = vmulps_avx512vl(auVar98,ZEXT1632(auVar94));
    auVar98 = vmulps_avx512vl(auVar98,ZEXT1632(auVar231));
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,ZEXT1632(auVar89));
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar102,ZEXT1632(auVar90));
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar102,ZEXT1632(auVar91));
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,ZEXT1632(auVar92));
    auVar185._0_4_ = auVar103._0_4_ * fVar151;
    auVar185._4_4_ = auVar103._4_4_ * fVar240;
    auVar185._8_4_ = auVar103._8_4_ * fVar242;
    auVar185._12_4_ = auVar103._12_4_ * fVar244;
    auVar185._16_4_ = auVar103._16_4_ * 0.0;
    auVar185._20_4_ = auVar103._20_4_ * 0.0;
    auVar185._24_4_ = auVar103._24_4_ * 0.0;
    auVar185._28_4_ = 0;
    auVar41._4_4_ = auVar104._4_4_ * fVar240;
    auVar41._0_4_ = auVar104._0_4_ * fVar151;
    auVar41._8_4_ = auVar104._8_4_ * fVar242;
    auVar41._12_4_ = auVar104._12_4_ * fVar244;
    auVar41._16_4_ = auVar104._16_4_ * 0.0;
    auVar41._20_4_ = auVar104._20_4_ * 0.0;
    auVar41._24_4_ = auVar104._24_4_ * 0.0;
    auVar41._28_4_ = auVar103._28_4_;
    auVar42._4_4_ = auVar100._4_4_ * fVar240;
    auVar42._0_4_ = auVar100._0_4_ * fVar151;
    auVar42._8_4_ = auVar100._8_4_ * fVar242;
    auVar42._12_4_ = auVar100._12_4_ * fVar244;
    auVar42._16_4_ = auVar100._16_4_ * 0.0;
    auVar42._20_4_ = auVar100._20_4_ * 0.0;
    auVar42._24_4_ = auVar100._24_4_ * 0.0;
    auVar42._28_4_ = auVar104._28_4_;
    auVar43._4_4_ = auVar105._4_4_ * fVar240;
    auVar43._0_4_ = auVar105._0_4_ * fVar151;
    auVar43._8_4_ = auVar105._8_4_ * fVar242;
    auVar43._12_4_ = auVar105._12_4_ * fVar244;
    auVar43._16_4_ = auVar105._16_4_ * 0.0;
    auVar43._20_4_ = auVar105._20_4_ * 0.0;
    auVar43._24_4_ = auVar105._24_4_ * 0.0;
    auVar43._28_4_ = auVar100._28_4_;
    auVar89 = vfmadd231ps_fma(auVar185,auVar102,ZEXT1632(auVar87));
    auVar90 = vfmadd231ps_fma(auVar41,auVar102,ZEXT1632(auVar93));
    auVar91 = vfmadd231ps_fma(auVar42,auVar102,ZEXT1632(auVar94));
    auVar92 = vfmadd231ps_fma(auVar43,auVar102,ZEXT1632(auVar231));
    auVar103 = vmulps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar91));
    auVar105 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar244 * auVar89._12_4_,
                                             CONCAT48(fVar242 * auVar89._8_4_,
                                                      CONCAT44(fVar240 * auVar89._4_4_,
                                                               fVar151 * auVar89._0_4_)))),auVar102,
                          auVar106);
    auVar230 = ZEXT3264(auVar105);
    auVar109 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar90._12_4_ * fVar244,
                                             CONCAT48(auVar90._8_4_ * fVar242,
                                                      CONCAT44(auVar90._4_4_ * fVar240,
                                                               auVar90._0_4_ * fVar151)))),auVar102,
                          auVar107);
    auVar110 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar108);
    auVar104 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar92._12_4_ * fVar244,
                                             CONCAT48(auVar92._8_4_ * fVar242,
                                                      CONCAT44(auVar92._4_4_ * fVar240,
                                                               auVar92._0_4_ * fVar151)))),auVar98,
                          auVar102);
    auVar102 = vsubps_avx512vl(ZEXT1632(auVar89),auVar106);
    auVar103 = vsubps_avx512vl(ZEXT1632(auVar90),auVar107);
    auVar100 = vsubps_avx512vl(ZEXT1632(auVar91),auVar108);
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar92),auVar98);
    auVar253._0_4_ = fVar252 * auVar102._0_4_ * 3.0;
    auVar253._4_4_ = fVar252 * auVar102._4_4_ * 3.0;
    auVar253._8_4_ = fVar252 * auVar102._8_4_ * 3.0;
    auVar253._12_4_ = fVar252 * auVar102._12_4_ * 3.0;
    auVar253._16_4_ = fVar252 * auVar102._16_4_ * 3.0;
    auVar253._20_4_ = fVar252 * auVar102._20_4_ * 3.0;
    auVar253._24_4_ = fVar252 * auVar102._24_4_ * 3.0;
    auVar253._28_4_ = 0;
    auVar255._0_4_ = fVar252 * auVar103._0_4_ * 3.0;
    auVar255._4_4_ = fVar252 * auVar103._4_4_ * 3.0;
    auVar255._8_4_ = fVar252 * auVar103._8_4_ * 3.0;
    auVar255._12_4_ = fVar252 * auVar103._12_4_ * 3.0;
    auVar255._16_4_ = fVar252 * auVar103._16_4_ * 3.0;
    auVar255._20_4_ = fVar252 * auVar103._20_4_ * 3.0;
    auVar255._24_4_ = fVar252 * auVar103._24_4_ * 3.0;
    auVar255._28_4_ = 0;
    auVar256._0_4_ = auVar100._0_4_ * 3.0 * fVar252;
    auVar256._4_4_ = auVar100._4_4_ * 3.0 * fVar252;
    auVar256._8_4_ = auVar100._8_4_ * 3.0 * fVar252;
    auVar256._12_4_ = auVar100._12_4_ * 3.0 * fVar252;
    auVar256._16_4_ = auVar100._16_4_ * 3.0 * fVar252;
    auVar256._20_4_ = auVar100._20_4_ * 3.0 * fVar252;
    auVar256._24_4_ = auVar100._24_4_ * 3.0 * fVar252;
    auVar256._28_4_ = 0;
    fVar151 = auVar106._0_4_ * 3.0 * fVar252;
    fVar240 = auVar106._4_4_ * 3.0 * fVar252;
    auVar44._4_4_ = fVar240;
    auVar44._0_4_ = fVar151;
    fVar242 = auVar106._8_4_ * 3.0 * fVar252;
    auVar44._8_4_ = fVar242;
    fVar244 = auVar106._12_4_ * 3.0 * fVar252;
    auVar44._12_4_ = fVar244;
    fVar246 = auVar106._16_4_ * 3.0 * fVar252;
    auVar44._16_4_ = fVar246;
    fVar247 = auVar106._20_4_ * 3.0 * fVar252;
    auVar44._20_4_ = fVar247;
    fVar213 = auVar106._24_4_ * 3.0 * fVar252;
    auVar44._24_4_ = fVar213;
    auVar44._28_4_ = fVar252;
    auVar86 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar106 = vpermt2ps_avx512vl(auVar105,_DAT_0205fd20,ZEXT1632(auVar86));
    auVar107 = vpermt2ps_avx512vl(auVar109,_DAT_0205fd20,ZEXT1632(auVar86));
    auVar100 = ZEXT1632(auVar86);
    auVar108 = vpermt2ps_avx512vl(auVar110,_DAT_0205fd20,auVar100);
    auVar186._0_4_ = auVar104._0_4_ + fVar151;
    auVar186._4_4_ = auVar104._4_4_ + fVar240;
    auVar186._8_4_ = auVar104._8_4_ + fVar242;
    auVar186._12_4_ = auVar104._12_4_ + fVar244;
    auVar186._16_4_ = auVar104._16_4_ + fVar246;
    auVar186._20_4_ = auVar104._20_4_ + fVar247;
    auVar186._24_4_ = auVar104._24_4_ + fVar213;
    auVar186._28_4_ = auVar104._28_4_ + fVar252;
    auVar102 = vmaxps_avx(auVar104,auVar186);
    auVar103 = vminps_avx(auVar104,auVar186);
    auVar98 = vpermt2ps_avx512vl(auVar104,_DAT_0205fd20,auVar100);
    auVar96 = vpermt2ps_avx512vl(auVar253,_DAT_0205fd20,auVar100);
    auVar97 = vpermt2ps_avx512vl(auVar255,_DAT_0205fd20,auVar100);
    auVar123 = ZEXT1632(auVar86);
    auVar111 = vpermt2ps_avx512vl(auVar256,_DAT_0205fd20,auVar123);
    auVar104 = vpermt2ps_avx512vl(auVar44,_DAT_0205fd20,auVar123);
    auVar112 = vsubps_avx512vl(auVar98,auVar104);
    auVar104 = vsubps_avx(auVar106,auVar105);
    auVar100 = vsubps_avx(auVar107,auVar109);
    auVar113 = vsubps_avx512vl(auVar108,auVar110);
    auVar114 = vmulps_avx512vl(auVar100,auVar256);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar255,auVar113);
    auVar115 = vmulps_avx512vl(auVar113,auVar253);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar256,auVar104);
    auVar116 = vmulps_avx512vl(auVar104,auVar255);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar253,auVar100);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar115 = vmulps_avx512vl(auVar113,auVar113);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar100,auVar100);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar104,auVar104);
    auVar116 = vrcp14ps_avx512vl(auVar115);
    auVar117 = vfnmadd213ps_avx512vl(auVar116,auVar115,auVar160);
    auVar116 = vfmadd132ps_avx512vl(auVar117,auVar116,auVar116);
    auVar114 = vmulps_avx512vl(auVar114,auVar116);
    auVar117 = vmulps_avx512vl(auVar100,auVar111);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar97,auVar113);
    auVar118 = vmulps_avx512vl(auVar113,auVar96);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar111,auVar104);
    auVar119 = vmulps_avx512vl(auVar104,auVar97);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar96,auVar100);
    auVar119 = vmulps_avx512vl(auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar116 = vmulps_avx512vl(auVar117,auVar116);
    auVar114 = vmaxps_avx512vl(auVar114,auVar116);
    auVar114 = vsqrtps_avx512vl(auVar114);
    auVar116 = vmaxps_avx512vl(auVar112,auVar98);
    auVar102 = vmaxps_avx512vl(auVar102,auVar116);
    auVar116 = vaddps_avx512vl(auVar114,auVar102);
    auVar102 = vminps_avx512vl(auVar112,auVar98);
    auVar102 = vminps_avx(auVar103,auVar102);
    auVar102 = vsubps_avx512vl(auVar102,auVar114);
    auVar127._8_4_ = 0x3f800002;
    auVar127._0_8_ = 0x3f8000023f800002;
    auVar127._12_4_ = 0x3f800002;
    auVar127._16_4_ = 0x3f800002;
    auVar127._20_4_ = 0x3f800002;
    auVar127._24_4_ = 0x3f800002;
    auVar127._28_4_ = 0x3f800002;
    auVar103 = vmulps_avx512vl(auVar116,auVar127);
    auVar128._8_4_ = 0x3f7ffffc;
    auVar128._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar128._12_4_ = 0x3f7ffffc;
    auVar128._16_4_ = 0x3f7ffffc;
    auVar128._20_4_ = 0x3f7ffffc;
    auVar128._24_4_ = 0x3f7ffffc;
    auVar128._28_4_ = 0x3f7ffffc;
    local_8a0 = vmulps_avx512vl(auVar102,auVar128);
    auVar45._4_4_ = auVar103._4_4_ * auVar103._4_4_;
    auVar45._0_4_ = auVar103._0_4_ * auVar103._0_4_;
    auVar45._8_4_ = auVar103._8_4_ * auVar103._8_4_;
    auVar45._12_4_ = auVar103._12_4_ * auVar103._12_4_;
    auVar45._16_4_ = auVar103._16_4_ * auVar103._16_4_;
    auVar45._20_4_ = auVar103._20_4_ * auVar103._20_4_;
    auVar45._24_4_ = auVar103._24_4_ * auVar103._24_4_;
    auVar45._28_4_ = local_8a0._28_4_;
    auVar102 = vrsqrt14ps_avx512vl(auVar115);
    auVar129._8_4_ = 0xbf000000;
    auVar129._0_8_ = 0xbf000000bf000000;
    auVar129._12_4_ = 0xbf000000;
    auVar129._16_4_ = 0xbf000000;
    auVar129._20_4_ = 0xbf000000;
    auVar129._24_4_ = 0xbf000000;
    auVar129._28_4_ = 0xbf000000;
    auVar103 = vmulps_avx512vl(auVar115,auVar129);
    auVar46._4_4_ = auVar102._4_4_ * auVar103._4_4_;
    auVar46._0_4_ = auVar102._0_4_ * auVar103._0_4_;
    auVar46._8_4_ = auVar102._8_4_ * auVar103._8_4_;
    auVar46._12_4_ = auVar102._12_4_ * auVar103._12_4_;
    auVar46._16_4_ = auVar102._16_4_ * auVar103._16_4_;
    auVar46._20_4_ = auVar102._20_4_ * auVar103._20_4_;
    auVar46._24_4_ = auVar102._24_4_ * auVar103._24_4_;
    auVar46._28_4_ = auVar103._28_4_;
    auVar103 = vmulps_avx512vl(auVar102,auVar102);
    auVar103 = vmulps_avx512vl(auVar103,auVar46);
    auVar130._8_4_ = 0x3fc00000;
    auVar130._0_8_ = 0x3fc000003fc00000;
    auVar130._12_4_ = 0x3fc00000;
    auVar130._16_4_ = 0x3fc00000;
    auVar130._20_4_ = 0x3fc00000;
    auVar130._24_4_ = 0x3fc00000;
    auVar130._28_4_ = 0x3fc00000;
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar130);
    auVar47._4_4_ = auVar103._4_4_ * auVar104._4_4_;
    auVar47._0_4_ = auVar103._0_4_ * auVar104._0_4_;
    auVar47._8_4_ = auVar103._8_4_ * auVar104._8_4_;
    auVar47._12_4_ = auVar103._12_4_ * auVar104._12_4_;
    auVar47._16_4_ = auVar103._16_4_ * auVar104._16_4_;
    auVar47._20_4_ = auVar103._20_4_ * auVar104._20_4_;
    auVar47._24_4_ = auVar103._24_4_ * auVar104._24_4_;
    auVar47._28_4_ = auVar102._28_4_;
    auVar102 = vmulps_avx512vl(auVar100,auVar103);
    auVar98 = vmulps_avx512vl(auVar113,auVar103);
    auVar112 = vsubps_avx512vl(auVar123,auVar105);
    auVar114 = vsubps_avx512vl(auVar123,auVar109);
    auVar115 = vsubps_avx512vl(auVar123,auVar110);
    auVar116 = vmulps_avx512vl(auVar258._0_32_,auVar115);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar99,auVar114);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar101,auVar112);
    auVar117 = vmulps_avx512vl(auVar115,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar114,auVar114);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar112,auVar112);
    auVar118 = vmulps_avx512vl(auVar258._0_32_,auVar98);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar102,auVar99);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar47,auVar101);
    auVar98 = vmulps_avx512vl(auVar115,auVar98);
    auVar102 = vfmadd231ps_avx512vl(auVar98,auVar114,auVar102);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar112,auVar47);
    local_6e0 = vmulps_avx512vl(auVar118,auVar118);
    auVar98 = vsubps_avx512vl(local_3e0,local_6e0);
    auVar119 = vmulps_avx512vl(auVar118,auVar102);
    auVar116 = vsubps_avx512vl(auVar116,auVar119);
    auVar116 = vaddps_avx512vl(auVar116,auVar116);
    auVar119 = vmulps_avx512vl(auVar102,auVar102);
    auVar117 = vsubps_avx512vl(auVar117,auVar119);
    auVar119 = vsubps_avx512vl(auVar117,auVar45);
    auVar120 = vmulps_avx512vl(auVar116,auVar116);
    auVar25._8_4_ = 0x40800000;
    auVar25._0_8_ = 0x4080000040800000;
    auVar25._12_4_ = 0x40800000;
    auVar25._16_4_ = 0x40800000;
    auVar25._20_4_ = 0x40800000;
    auVar25._24_4_ = 0x40800000;
    auVar25._28_4_ = 0x40800000;
    auVar121 = vmulps_avx512vl(auVar98,auVar25);
    auVar122 = vmulps_avx512vl(auVar121,auVar119);
    auVar122 = vsubps_avx512vl(auVar120,auVar122);
    auVar86 = vxorps_avx512vl(auVar117._0_16_,auVar117._0_16_);
    uVar84 = vcmpps_avx512vl(auVar122,auVar123,5);
    bVar73 = (byte)uVar84;
    if (bVar73 == 0) {
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar122 = vsqrtps_avx512vl(auVar122);
      auVar123 = vaddps_avx512vl(auVar98,auVar98);
      auVar124 = vrcp14ps_avx512vl(auVar123);
      auVar123 = vfnmadd213ps_avx512vl(auVar123,auVar124,auVar160);
      auVar123 = vfmadd132ps_avx512vl(auVar123,auVar124,auVar124);
      auVar26._8_4_ = 0x80000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar26._12_4_ = 0x80000000;
      auVar26._16_4_ = 0x80000000;
      auVar26._20_4_ = 0x80000000;
      auVar26._24_4_ = 0x80000000;
      auVar26._28_4_ = 0x80000000;
      auVar124 = vxorps_avx512vl(auVar116,auVar26);
      auVar124 = vsubps_avx512vl(auVar124,auVar122);
      auVar124 = vmulps_avx512vl(auVar124,auVar123);
      auVar122 = vsubps_avx512vl(auVar122,auVar116);
      auVar122 = vmulps_avx512vl(auVar122,auVar123);
      auVar123 = vfmadd213ps_avx512vl(auVar118,auVar124,auVar102);
      local_660 = vmulps_avx512vl(auVar103,auVar123);
      auVar123 = vfmadd213ps_avx512vl(auVar118,auVar122,auVar102);
      local_680 = vmulps_avx512vl(auVar103,auVar123);
      auVar161._8_4_ = 0x7f800000;
      auVar161._0_8_ = 0x7f8000007f800000;
      auVar161._12_4_ = 0x7f800000;
      auVar161._16_4_ = 0x7f800000;
      auVar161._20_4_ = 0x7f800000;
      auVar161._24_4_ = 0x7f800000;
      auVar161._28_4_ = 0x7f800000;
      auVar123 = vblendmps_avx512vl(auVar161,auVar124);
      auVar125._0_4_ =
           (uint)(bVar73 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar73 & 1) * local_680._0_4_;
      bVar6 = (bool)((byte)(uVar84 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar6 * auVar123._4_4_ | (uint)!bVar6 * local_680._4_4_;
      bVar6 = (bool)((byte)(uVar84 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar6 * auVar123._8_4_ | (uint)!bVar6 * local_680._8_4_;
      bVar6 = (bool)((byte)(uVar84 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar6 * auVar123._12_4_ | (uint)!bVar6 * local_680._12_4_;
      bVar6 = (bool)((byte)(uVar84 >> 4) & 1);
      auVar125._16_4_ = (uint)bVar6 * auVar123._16_4_ | (uint)!bVar6 * local_680._16_4_;
      bVar6 = (bool)((byte)(uVar84 >> 5) & 1);
      auVar125._20_4_ = (uint)bVar6 * auVar123._20_4_ | (uint)!bVar6 * local_680._20_4_;
      bVar6 = (bool)((byte)(uVar84 >> 6) & 1);
      auVar125._24_4_ = (uint)bVar6 * auVar123._24_4_ | (uint)!bVar6 * local_680._24_4_;
      bVar6 = SUB81(uVar84 >> 7,0);
      auVar125._28_4_ = (uint)bVar6 * auVar123._28_4_ | (uint)!bVar6 * local_680._28_4_;
      auVar162._8_4_ = 0xff800000;
      auVar162._0_8_ = 0xff800000ff800000;
      auVar162._12_4_ = 0xff800000;
      auVar162._16_4_ = 0xff800000;
      auVar162._20_4_ = 0xff800000;
      auVar162._24_4_ = 0xff800000;
      auVar162._28_4_ = 0xff800000;
      auVar123 = vblendmps_avx512vl(auVar162,auVar122);
      auVar126._0_4_ =
           (uint)(bVar73 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar122._0_4_;
      bVar6 = (bool)((byte)(uVar84 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar6 * auVar123._4_4_ | (uint)!bVar6 * auVar122._4_4_;
      bVar6 = (bool)((byte)(uVar84 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar6 * auVar123._8_4_ | (uint)!bVar6 * auVar122._8_4_;
      bVar6 = (bool)((byte)(uVar84 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar6 * auVar123._12_4_ | (uint)!bVar6 * auVar122._12_4_;
      bVar6 = (bool)((byte)(uVar84 >> 4) & 1);
      auVar126._16_4_ = (uint)bVar6 * auVar123._16_4_ | (uint)!bVar6 * auVar122._16_4_;
      bVar6 = (bool)((byte)(uVar84 >> 5) & 1);
      auVar126._20_4_ = (uint)bVar6 * auVar123._20_4_ | (uint)!bVar6 * auVar122._20_4_;
      bVar6 = (bool)((byte)(uVar84 >> 6) & 1);
      auVar126._24_4_ = (uint)bVar6 * auVar123._24_4_ | (uint)!bVar6 * auVar122._24_4_;
      bVar6 = SUB81(uVar84 >> 7,0);
      auVar126._28_4_ = (uint)bVar6 * auVar123._28_4_ | (uint)!bVar6 * auVar122._28_4_;
      auVar163._8_4_ = 0x7fffffff;
      auVar163._0_8_ = 0x7fffffff7fffffff;
      auVar163._12_4_ = 0x7fffffff;
      auVar163._16_4_ = 0x7fffffff;
      auVar163._20_4_ = 0x7fffffff;
      auVar163._24_4_ = 0x7fffffff;
      auVar163._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_6e0,auVar163);
      auVar122 = vmaxps_avx512vl(local_5c0,local_6e0);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      auVar123 = vmulps_avx512vl(auVar122,auVar27);
      auVar122 = vandps_avx(auVar98,auVar163);
      uVar76 = vcmpps_avx512vl(auVar122,auVar123,1);
      uVar84 = uVar84 & uVar76;
      bVar80 = (byte)uVar84;
      if (bVar80 != 0) {
        uVar76 = vcmpps_avx512vl(auVar119,ZEXT1632(auVar86),2);
        auVar192._8_4_ = 0xff800000;
        auVar192._0_8_ = 0xff800000ff800000;
        auVar192._12_4_ = 0xff800000;
        auVar192._16_4_ = 0xff800000;
        auVar192._20_4_ = 0xff800000;
        auVar192._24_4_ = 0xff800000;
        auVar192._28_4_ = 0xff800000;
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar123 = vblendmps_avx512vl(auVar119,auVar192);
        bVar77 = (byte)uVar76;
        uVar85 = (uint)(bVar77 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar122._0_4_;
        bVar6 = (bool)((byte)(uVar76 >> 1) & 1);
        uVar144 = (uint)bVar6 * auVar123._4_4_ | (uint)!bVar6 * auVar122._4_4_;
        bVar6 = (bool)((byte)(uVar76 >> 2) & 1);
        uVar145 = (uint)bVar6 * auVar123._8_4_ | (uint)!bVar6 * auVar122._8_4_;
        bVar6 = (bool)((byte)(uVar76 >> 3) & 1);
        uVar146 = (uint)bVar6 * auVar123._12_4_ | (uint)!bVar6 * auVar122._12_4_;
        bVar6 = (bool)((byte)(uVar76 >> 4) & 1);
        uVar147 = (uint)bVar6 * auVar123._16_4_ | (uint)!bVar6 * auVar122._16_4_;
        bVar6 = (bool)((byte)(uVar76 >> 5) & 1);
        uVar148 = (uint)bVar6 * auVar123._20_4_ | (uint)!bVar6 * auVar122._20_4_;
        bVar6 = (bool)((byte)(uVar76 >> 6) & 1);
        uVar149 = (uint)bVar6 * auVar123._24_4_ | (uint)!bVar6 * auVar122._24_4_;
        bVar6 = SUB81(uVar76 >> 7,0);
        uVar150 = (uint)bVar6 * auVar123._28_4_ | (uint)!bVar6 * auVar122._28_4_;
        auVar125._0_4_ = (bVar80 & 1) * uVar85 | !(bool)(bVar80 & 1) * auVar125._0_4_;
        bVar6 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar125._4_4_ = bVar6 * uVar144 | !bVar6 * auVar125._4_4_;
        bVar6 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar125._8_4_ = bVar6 * uVar145 | !bVar6 * auVar125._8_4_;
        bVar6 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar125._12_4_ = bVar6 * uVar146 | !bVar6 * auVar125._12_4_;
        bVar6 = (bool)((byte)(uVar84 >> 4) & 1);
        auVar125._16_4_ = bVar6 * uVar147 | !bVar6 * auVar125._16_4_;
        bVar6 = (bool)((byte)(uVar84 >> 5) & 1);
        auVar125._20_4_ = bVar6 * uVar148 | !bVar6 * auVar125._20_4_;
        bVar6 = (bool)((byte)(uVar84 >> 6) & 1);
        auVar125._24_4_ = bVar6 * uVar149 | !bVar6 * auVar125._24_4_;
        bVar6 = SUB81(uVar84 >> 7,0);
        auVar125._28_4_ = bVar6 * uVar150 | !bVar6 * auVar125._28_4_;
        auVar119 = vblendmps_avx512vl(auVar192,auVar119);
        bVar6 = (bool)((byte)(uVar76 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar76 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar76 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar76 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar76 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar76 >> 6) & 1);
        bVar12 = SUB81(uVar76 >> 7,0);
        auVar126._0_4_ =
             (uint)(bVar80 & 1) *
             ((uint)(bVar77 & 1) * auVar119._0_4_ | !(bool)(bVar77 & 1) * uVar85) |
             !(bool)(bVar80 & 1) * auVar126._0_4_;
        bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar126._4_4_ =
             (uint)bVar83 * ((uint)bVar6 * auVar119._4_4_ | !bVar6 * uVar144) |
             !bVar83 * auVar126._4_4_;
        bVar6 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar126._8_4_ =
             (uint)bVar6 * ((uint)bVar7 * auVar119._8_4_ | !bVar7 * uVar145) |
             !bVar6 * auVar126._8_4_;
        bVar6 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar126._12_4_ =
             (uint)bVar6 * ((uint)bVar8 * auVar119._12_4_ | !bVar8 * uVar146) |
             !bVar6 * auVar126._12_4_;
        bVar6 = (bool)((byte)(uVar84 >> 4) & 1);
        auVar126._16_4_ =
             (uint)bVar6 * ((uint)bVar9 * auVar119._16_4_ | !bVar9 * uVar147) |
             !bVar6 * auVar126._16_4_;
        bVar6 = (bool)((byte)(uVar84 >> 5) & 1);
        auVar126._20_4_ =
             (uint)bVar6 * ((uint)bVar10 * auVar119._20_4_ | !bVar10 * uVar148) |
             !bVar6 * auVar126._20_4_;
        bVar6 = (bool)((byte)(uVar84 >> 6) & 1);
        auVar126._24_4_ =
             (uint)bVar6 * ((uint)bVar11 * auVar119._24_4_ | !bVar11 * uVar149) |
             !bVar6 * auVar126._24_4_;
        bVar6 = SUB81(uVar84 >> 7,0);
        auVar126._28_4_ =
             (uint)bVar6 * ((uint)bVar12 * auVar119._28_4_ | !bVar12 * uVar150) |
             !bVar6 * auVar126._28_4_;
        bVar73 = (~bVar80 | bVar77) & bVar73;
      }
      auVar160._8_4_ = 0x3f800000;
      auVar160._0_8_ = &DAT_3f8000003f800000;
      auVar160._12_4_ = 0x3f800000;
      auVar160._16_4_ = 0x3f800000;
      auVar160._20_4_ = 0x3f800000;
      auVar160._24_4_ = 0x3f800000;
      auVar160._28_4_ = 0x3f800000;
    }
    in_ZMM31 = ZEXT3264(auVar126);
    if ((bVar73 & 0x7f) == 0) {
      auVar220 = ZEXT3264(_DAT_02020f20);
      auVar258 = ZEXT3264(local_8c0);
    }
    else {
      fVar151 = *(float *)(ray + k * 4 + 0x100) - (float)local_810._0_4_;
      auVar164._4_4_ = fVar151;
      auVar164._0_4_ = fVar151;
      auVar164._8_4_ = fVar151;
      auVar164._12_4_ = fVar151;
      auVar164._16_4_ = fVar151;
      auVar164._20_4_ = fVar151;
      auVar164._24_4_ = fVar151;
      auVar164._28_4_ = fVar151;
      auVar119 = vminps_avx512vl(auVar164,auVar126);
      auVar69._4_4_ = fStack_3fc;
      auVar69._0_4_ = local_400;
      auVar69._8_4_ = fStack_3f8;
      auVar69._12_4_ = fStack_3f4;
      auVar69._16_4_ = fStack_3f0;
      auVar69._20_4_ = fStack_3ec;
      auVar69._24_4_ = fStack_3e8;
      auVar69._28_4_ = fStack_3e4;
      auVar122 = vmaxps_avx512vl(auVar69,auVar125);
      auVar115 = vmulps_avx512vl(auVar115,auVar256);
      auVar114 = vfmadd213ps_avx512vl(auVar114,auVar255,auVar115);
      auVar112 = vfmadd213ps_avx512vl(auVar112,auVar253,auVar114);
      auVar258 = ZEXT3264(local_8c0);
      auVar114 = vmulps_avx512vl(local_8c0,auVar256);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar99,auVar255);
      in_ZMM31 = ZEXT3264(auVar101);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar101,auVar253);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar114,auVar115);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar15 = vcmpps_avx512vl(auVar115,auVar123,1);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar112 = vxorps_avx512vl(auVar112,auVar124);
      auVar127 = vrcp14ps_avx512vl(auVar114);
      auVar128 = vxorps_avx512vl(auVar114,auVar124);
      auVar129 = vfnmadd213ps_avx512vl(auVar127,auVar114,auVar160);
      auVar129 = vfmadd132ps_avx512vl(auVar129,auVar127,auVar127);
      auVar129 = vmulps_avx512vl(auVar129,auVar112);
      uVar17 = vcmpps_avx512vl(auVar114,auVar128,1);
      bVar80 = (byte)uVar15 | (byte)uVar17;
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar112 = vblendmps_avx512vl(auVar129,auVar130);
      auVar131._0_4_ =
           (uint)(bVar80 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar127._0_4_;
      bVar6 = (bool)(bVar80 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar6 * auVar112._4_4_ | (uint)!bVar6 * auVar127._4_4_;
      bVar6 = (bool)(bVar80 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar6 * auVar112._8_4_ | (uint)!bVar6 * auVar127._8_4_;
      bVar6 = (bool)(bVar80 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar6 * auVar112._12_4_ | (uint)!bVar6 * auVar127._12_4_;
      bVar6 = (bool)(bVar80 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar6 * auVar112._16_4_ | (uint)!bVar6 * auVar127._16_4_;
      bVar6 = (bool)(bVar80 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar6 * auVar112._20_4_ | (uint)!bVar6 * auVar127._20_4_;
      bVar6 = (bool)(bVar80 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar6 * auVar112._24_4_ | (uint)!bVar6 * auVar127._24_4_;
      auVar131._28_4_ =
           (uint)(bVar80 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar80 >> 7) * auVar127._28_4_;
      auVar112 = vmaxps_avx(auVar122,auVar131);
      uVar17 = vcmpps_avx512vl(auVar114,auVar128,6);
      bVar80 = (byte)uVar15 | (byte)uVar17;
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar132._0_4_ =
           (uint)(bVar80 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar129._0_4_;
      bVar6 = (bool)(bVar80 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar6 * auVar122._4_4_ | (uint)!bVar6 * auVar129._4_4_;
      bVar6 = (bool)(bVar80 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar6 * auVar122._8_4_ | (uint)!bVar6 * auVar129._8_4_;
      bVar6 = (bool)(bVar80 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar6 * auVar122._12_4_ | (uint)!bVar6 * auVar129._12_4_;
      bVar6 = (bool)(bVar80 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar6 * auVar122._16_4_ | (uint)!bVar6 * auVar129._16_4_;
      bVar6 = (bool)(bVar80 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar6 * auVar122._20_4_ | (uint)!bVar6 * auVar129._20_4_;
      bVar6 = (bool)(bVar80 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar6 * auVar122._24_4_ | (uint)!bVar6 * auVar129._24_4_;
      auVar132._28_4_ =
           (uint)(bVar80 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar80 >> 7) * auVar129._28_4_;
      auVar114 = vminps_avx(auVar119,auVar132);
      auVar106 = vsubps_avx(ZEXT832(0) << 0x20,auVar106);
      auVar107 = vsubps_avx(ZEXT832(0) << 0x20,auVar107);
      auVar119 = ZEXT832(0) << 0x20;
      auVar108 = vsubps_avx(auVar119,auVar108);
      auVar48._4_4_ = auVar108._4_4_ * auVar111._4_4_;
      auVar48._0_4_ = auVar108._0_4_ * auVar111._0_4_;
      auVar48._8_4_ = auVar108._8_4_ * auVar111._8_4_;
      auVar48._12_4_ = auVar108._12_4_ * auVar111._12_4_;
      auVar48._16_4_ = auVar108._16_4_ * auVar111._16_4_;
      auVar48._20_4_ = auVar108._20_4_ * auVar111._20_4_;
      auVar48._24_4_ = auVar108._24_4_ * auVar111._24_4_;
      auVar48._28_4_ = auVar108._28_4_;
      auVar107 = vfnmsub231ps_avx512vl(auVar48,auVar97,auVar107);
      auVar106 = vfnmadd231ps_avx512vl(auVar107,auVar96,auVar106);
      auVar107 = vmulps_avx512vl(local_8c0,auVar111);
      auVar107 = vfnmsub231ps_avx512vl(auVar107,auVar99,auVar97);
      auVar107 = vfnmadd231ps_avx512vl(auVar107,auVar101,auVar96);
      vandps_avx512vl(auVar107,auVar115);
      uVar15 = vcmpps_avx512vl(auVar107,auVar123,1);
      auVar106 = vxorps_avx512vl(auVar106,auVar124);
      auVar108 = vrcp14ps_avx512vl(auVar107);
      auVar96 = vxorps_avx512vl(auVar107,auVar124);
      auVar111 = vfnmadd213ps_avx512vl(auVar108,auVar107,auVar160);
      auVar86 = vfmadd132ps_fma(auVar111,auVar108,auVar108);
      fVar151 = auVar86._0_4_ * auVar106._0_4_;
      fVar240 = auVar86._4_4_ * auVar106._4_4_;
      auVar49._4_4_ = fVar240;
      auVar49._0_4_ = fVar151;
      fVar242 = auVar86._8_4_ * auVar106._8_4_;
      auVar49._8_4_ = fVar242;
      fVar244 = auVar86._12_4_ * auVar106._12_4_;
      auVar49._12_4_ = fVar244;
      fVar252 = auVar106._16_4_ * 0.0;
      auVar49._16_4_ = fVar252;
      fVar246 = auVar106._20_4_ * 0.0;
      auVar49._20_4_ = fVar246;
      fVar247 = auVar106._24_4_ * 0.0;
      auVar49._24_4_ = fVar247;
      auVar49._28_4_ = auVar106._28_4_;
      uVar17 = vcmpps_avx512vl(auVar107,auVar96,1);
      bVar80 = (byte)uVar15 | (byte)uVar17;
      auVar111 = vblendmps_avx512vl(auVar49,auVar130);
      auVar133._0_4_ =
           (uint)(bVar80 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar108._0_4_;
      bVar6 = (bool)(bVar80 >> 1 & 1);
      auVar133._4_4_ = (uint)bVar6 * auVar111._4_4_ | (uint)!bVar6 * auVar108._4_4_;
      bVar6 = (bool)(bVar80 >> 2 & 1);
      auVar133._8_4_ = (uint)bVar6 * auVar111._8_4_ | (uint)!bVar6 * auVar108._8_4_;
      bVar6 = (bool)(bVar80 >> 3 & 1);
      auVar133._12_4_ = (uint)bVar6 * auVar111._12_4_ | (uint)!bVar6 * auVar108._12_4_;
      bVar6 = (bool)(bVar80 >> 4 & 1);
      auVar133._16_4_ = (uint)bVar6 * auVar111._16_4_ | (uint)!bVar6 * auVar108._16_4_;
      bVar6 = (bool)(bVar80 >> 5 & 1);
      auVar133._20_4_ = (uint)bVar6 * auVar111._20_4_ | (uint)!bVar6 * auVar108._20_4_;
      bVar6 = (bool)(bVar80 >> 6 & 1);
      auVar133._24_4_ = (uint)bVar6 * auVar111._24_4_ | (uint)!bVar6 * auVar108._24_4_;
      auVar133._28_4_ =
           (uint)(bVar80 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar80 >> 7) * auVar108._28_4_;
      _local_720 = vmaxps_avx(auVar112,auVar133);
      uVar17 = vcmpps_avx512vl(auVar107,auVar96,6);
      bVar80 = (byte)uVar15 | (byte)uVar17;
      auVar134._0_4_ =
           (uint)(bVar80 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar80 & 1) * (int)fVar151;
      bVar6 = (bool)(bVar80 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar6 * auVar122._4_4_ | (uint)!bVar6 * (int)fVar240;
      bVar6 = (bool)(bVar80 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar6 * auVar122._8_4_ | (uint)!bVar6 * (int)fVar242;
      bVar6 = (bool)(bVar80 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar6 * auVar122._12_4_ | (uint)!bVar6 * (int)fVar244;
      bVar6 = (bool)(bVar80 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar6 * auVar122._16_4_ | (uint)!bVar6 * (int)fVar252;
      bVar6 = (bool)(bVar80 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar6 * auVar122._20_4_ | (uint)!bVar6 * (int)fVar246;
      bVar6 = (bool)(bVar80 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar6 * auVar122._24_4_ | (uint)!bVar6 * (int)fVar247;
      auVar134._28_4_ =
           (uint)(bVar80 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar80 >> 7) * auVar106._28_4_;
      local_460 = vminps_avx(auVar114,auVar134);
      uVar15 = vcmpps_avx512vl(_local_720,local_460,2);
      bVar73 = bVar73 & 0x7f & (byte)uVar15;
      if (bVar73 == 0) {
        auVar220 = ZEXT3264(_DAT_02020f20);
      }
      else {
        auVar106 = vmaxps_avx(auVar119,local_8a0);
        auVar107 = vminps_avx512vl(local_660,auVar160);
        auVar55 = ZEXT412(0);
        auVar108 = ZEXT1232(auVar55) << 0x20;
        auVar107 = vmaxps_avx(auVar107,ZEXT1232(auVar55) << 0x20);
        auVar96 = vminps_avx512vl(local_680,auVar160);
        auVar50._4_4_ = (auVar107._4_4_ + 1.0) * 0.125;
        auVar50._0_4_ = (auVar107._0_4_ + 0.0) * 0.125;
        auVar50._8_4_ = (auVar107._8_4_ + 2.0) * 0.125;
        auVar50._12_4_ = (auVar107._12_4_ + 3.0) * 0.125;
        auVar50._16_4_ = (auVar107._16_4_ + 4.0) * 0.125;
        auVar50._20_4_ = (auVar107._20_4_ + 5.0) * 0.125;
        auVar50._24_4_ = (auVar107._24_4_ + 6.0) * 0.125;
        auVar50._28_4_ = auVar107._28_4_ + 7.0;
        local_660 = vfmadd213ps_avx512vl(auVar50,local_880,auVar235);
        auVar107 = vmaxps_avx(auVar96,ZEXT1232(auVar55) << 0x20);
        auVar51._4_4_ = (auVar107._4_4_ + 1.0) * 0.125;
        auVar51._0_4_ = (auVar107._0_4_ + 0.0) * 0.125;
        auVar51._8_4_ = (auVar107._8_4_ + 2.0) * 0.125;
        auVar51._12_4_ = (auVar107._12_4_ + 3.0) * 0.125;
        auVar51._16_4_ = (auVar107._16_4_ + 4.0) * 0.125;
        auVar51._20_4_ = (auVar107._20_4_ + 5.0) * 0.125;
        auVar51._24_4_ = (auVar107._24_4_ + 6.0) * 0.125;
        auVar51._28_4_ = auVar107._28_4_ + 7.0;
        local_680 = vfmadd213ps_avx512vl(auVar51,local_880,auVar235);
        auVar52._4_4_ = auVar106._4_4_ * auVar106._4_4_;
        auVar52._0_4_ = auVar106._0_4_ * auVar106._0_4_;
        auVar52._8_4_ = auVar106._8_4_ * auVar106._8_4_;
        auVar52._12_4_ = auVar106._12_4_ * auVar106._12_4_;
        auVar52._16_4_ = auVar106._16_4_ * auVar106._16_4_;
        auVar52._20_4_ = auVar106._20_4_ * auVar106._20_4_;
        auVar52._24_4_ = auVar106._24_4_ * auVar106._24_4_;
        auVar52._28_4_ = local_680._28_4_;
        auVar106 = vsubps_avx(auVar117,auVar52);
        auVar107 = vmulps_avx512vl(auVar121,auVar106);
        auVar107 = vsubps_avx512vl(auVar120,auVar107);
        uVar15 = vcmpps_avx512vl(auVar107,ZEXT1232(auVar55) << 0x20,5);
        bVar80 = (byte)uVar15;
        if (bVar80 == 0) {
          auVar102 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar96 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar97 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar135._8_4_ = 0x7f800000;
          auVar135._0_8_ = 0x7f8000007f800000;
          auVar135._12_4_ = 0x7f800000;
          auVar135._16_4_ = 0x7f800000;
          auVar135._20_4_ = 0x7f800000;
          auVar135._24_4_ = 0x7f800000;
          auVar135._28_4_ = 0x7f800000;
          auVar136._8_4_ = 0xff800000;
          auVar136._0_8_ = 0xff800000ff800000;
          auVar136._12_4_ = 0xff800000;
          auVar136._16_4_ = 0xff800000;
          auVar136._20_4_ = 0xff800000;
          auVar136._24_4_ = 0xff800000;
          auVar136._28_4_ = 0xff800000;
        }
        else {
          auVar89 = vxorps_avx512vl(auVar97._0_16_,auVar97._0_16_);
          uVar84 = vcmpps_avx512vl(auVar107,auVar119,5);
          auVar107 = vsqrtps_avx(auVar107);
          auVar187._0_4_ = auVar98._0_4_ + auVar98._0_4_;
          auVar187._4_4_ = auVar98._4_4_ + auVar98._4_4_;
          auVar187._8_4_ = auVar98._8_4_ + auVar98._8_4_;
          auVar187._12_4_ = auVar98._12_4_ + auVar98._12_4_;
          auVar187._16_4_ = auVar98._16_4_ + auVar98._16_4_;
          auVar187._20_4_ = auVar98._20_4_ + auVar98._20_4_;
          auVar187._24_4_ = auVar98._24_4_ + auVar98._24_4_;
          auVar187._28_4_ = auVar98._28_4_ + auVar98._28_4_;
          auVar108 = vrcp14ps_avx512vl(auVar187);
          auVar96 = vfnmadd213ps_avx512vl(auVar187,auVar108,auVar160);
          auVar86 = vfmadd132ps_fma(auVar96,auVar108,auVar108);
          auVar28._8_4_ = 0x80000000;
          auVar28._0_8_ = 0x8000000080000000;
          auVar28._12_4_ = 0x80000000;
          auVar28._16_4_ = 0x80000000;
          auVar28._20_4_ = 0x80000000;
          auVar28._24_4_ = 0x80000000;
          auVar28._28_4_ = 0x80000000;
          auVar108 = vxorps_avx512vl(auVar116,auVar28);
          auVar108 = vsubps_avx(auVar108,auVar107);
          auVar53._4_4_ = auVar108._4_4_ * auVar86._4_4_;
          auVar53._0_4_ = auVar108._0_4_ * auVar86._0_4_;
          auVar53._8_4_ = auVar108._8_4_ * auVar86._8_4_;
          auVar53._12_4_ = auVar108._12_4_ * auVar86._12_4_;
          auVar53._16_4_ = auVar108._16_4_ * 0.0;
          auVar53._20_4_ = auVar108._20_4_ * 0.0;
          auVar53._24_4_ = auVar108._24_4_ * 0.0;
          auVar53._28_4_ = 0x3e000000;
          auVar107 = vsubps_avx512vl(auVar107,auVar116);
          auVar257._0_4_ = auVar107._0_4_ * auVar86._0_4_;
          auVar257._4_4_ = auVar107._4_4_ * auVar86._4_4_;
          auVar257._8_4_ = auVar107._8_4_ * auVar86._8_4_;
          auVar257._12_4_ = auVar107._12_4_ * auVar86._12_4_;
          auVar257._16_4_ = auVar107._16_4_ * 0.0;
          auVar257._20_4_ = auVar107._20_4_ * 0.0;
          auVar257._24_4_ = auVar107._24_4_ * 0.0;
          auVar257._28_4_ = 0;
          auVar107 = vfmadd213ps_avx512vl(auVar118,auVar53,auVar102);
          auVar54._4_4_ = auVar103._4_4_ * auVar107._4_4_;
          auVar54._0_4_ = auVar103._0_4_ * auVar107._0_4_;
          auVar54._8_4_ = auVar103._8_4_ * auVar107._8_4_;
          auVar54._12_4_ = auVar103._12_4_ * auVar107._12_4_;
          auVar54._16_4_ = auVar103._16_4_ * auVar107._16_4_;
          auVar54._20_4_ = auVar103._20_4_ * auVar107._20_4_;
          auVar54._24_4_ = auVar103._24_4_ * auVar107._24_4_;
          auVar54._28_4_ = auVar108._28_4_;
          auVar107 = vmulps_avx512vl(auVar101,auVar53);
          auVar108 = vmulps_avx512vl(auVar99,auVar53);
          auVar111 = vmulps_avx512vl(local_8c0,auVar53);
          auVar96 = vfmadd213ps_avx512vl(auVar104,auVar54,auVar105);
          auVar96 = vsubps_avx512vl(auVar107,auVar96);
          auVar107 = vfmadd213ps_avx512vl(auVar100,auVar54,auVar109);
          auVar97 = vsubps_avx512vl(auVar108,auVar107);
          auVar86 = vfmadd213ps_fma(auVar54,auVar113,auVar110);
          auVar107 = vsubps_avx(auVar111,ZEXT1632(auVar86));
          auVar102 = vfmadd213ps_avx512vl(auVar118,auVar257,auVar102);
          auVar103 = vmulps_avx512vl(auVar103,auVar102);
          auVar102 = vmulps_avx512vl(auVar101,auVar257);
          auVar111 = vmulps_avx512vl(auVar99,auVar257);
          auVar112 = vmulps_avx512vl(local_8c0,auVar257);
          auVar86 = vfmadd213ps_fma(auVar104,auVar103,auVar105);
          auVar108 = vsubps_avx(auVar102,ZEXT1632(auVar86));
          auVar86 = vfmadd213ps_fma(auVar100,auVar103,auVar109);
          auVar102 = vsubps_avx512vl(auVar111,ZEXT1632(auVar86));
          auVar86 = vfmadd213ps_fma(auVar113,auVar103,auVar110);
          auVar103 = vsubps_avx512vl(auVar112,ZEXT1632(auVar86));
          auVar205._8_4_ = 0x7f800000;
          auVar205._0_8_ = 0x7f8000007f800000;
          auVar205._12_4_ = 0x7f800000;
          auVar205._16_4_ = 0x7f800000;
          auVar205._20_4_ = 0x7f800000;
          auVar205._24_4_ = 0x7f800000;
          auVar205._28_4_ = 0x7f800000;
          auVar104 = vblendmps_avx512vl(auVar205,auVar53);
          bVar6 = (bool)((byte)uVar84 & 1);
          auVar135._0_4_ = (uint)bVar6 * auVar104._0_4_ | (uint)!bVar6 * auVar105._0_4_;
          bVar6 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar135._4_4_ = (uint)bVar6 * auVar104._4_4_ | (uint)!bVar6 * auVar105._4_4_;
          bVar6 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar135._8_4_ = (uint)bVar6 * auVar104._8_4_ | (uint)!bVar6 * auVar105._8_4_;
          bVar6 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar135._12_4_ = (uint)bVar6 * auVar104._12_4_ | (uint)!bVar6 * auVar105._12_4_;
          bVar6 = (bool)((byte)(uVar84 >> 4) & 1);
          auVar135._16_4_ = (uint)bVar6 * auVar104._16_4_ | (uint)!bVar6 * auVar105._16_4_;
          bVar6 = (bool)((byte)(uVar84 >> 5) & 1);
          auVar135._20_4_ = (uint)bVar6 * auVar104._20_4_ | (uint)!bVar6 * auVar105._20_4_;
          bVar6 = (bool)((byte)(uVar84 >> 6) & 1);
          auVar135._24_4_ = (uint)bVar6 * auVar104._24_4_ | (uint)!bVar6 * auVar105._24_4_;
          bVar6 = SUB81(uVar84 >> 7,0);
          auVar135._28_4_ = (uint)bVar6 * auVar104._28_4_ | (uint)!bVar6 * auVar105._28_4_;
          auVar206._8_4_ = 0xff800000;
          auVar206._0_8_ = 0xff800000ff800000;
          auVar206._12_4_ = 0xff800000;
          auVar206._16_4_ = 0xff800000;
          auVar206._20_4_ = 0xff800000;
          auVar206._24_4_ = 0xff800000;
          auVar206._28_4_ = 0xff800000;
          auVar104 = vblendmps_avx512vl(auVar206,auVar257);
          bVar6 = (bool)((byte)uVar84 & 1);
          auVar136._0_4_ = (uint)bVar6 * auVar104._0_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar6 * auVar104._4_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar6 * auVar104._8_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar6 * auVar104._12_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar84 >> 4) & 1);
          auVar136._16_4_ = (uint)bVar6 * auVar104._16_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar84 >> 5) & 1);
          auVar136._20_4_ = (uint)bVar6 * auVar104._20_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar84 >> 6) & 1);
          auVar136._24_4_ = (uint)bVar6 * auVar104._24_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = SUB81(uVar84 >> 7,0);
          auVar136._28_4_ = (uint)bVar6 * auVar104._28_4_ | (uint)!bVar6 * -0x800000;
          auVar249._8_4_ = 0x7fffffff;
          auVar249._0_8_ = 0x7fffffff7fffffff;
          auVar249._12_4_ = 0x7fffffff;
          auVar249._16_4_ = 0x7fffffff;
          auVar249._20_4_ = 0x7fffffff;
          auVar249._24_4_ = 0x7fffffff;
          auVar249._28_4_ = 0x7fffffff;
          auVar104 = vandps_avx(auVar249,local_6e0);
          auVar104 = vmaxps_avx(local_5c0,auVar104);
          auVar29._8_4_ = 0x36000000;
          auVar29._0_8_ = 0x3600000036000000;
          auVar29._12_4_ = 0x36000000;
          auVar29._16_4_ = 0x36000000;
          auVar29._20_4_ = 0x36000000;
          auVar29._24_4_ = 0x36000000;
          auVar29._28_4_ = 0x36000000;
          auVar100 = vmulps_avx512vl(auVar104,auVar29);
          auVar104 = vandps_avx(auVar98,auVar249);
          uVar76 = vcmpps_avx512vl(auVar104,auVar100,1);
          uVar84 = uVar84 & uVar76;
          bVar77 = (byte)uVar84;
          if (bVar77 != 0) {
            uVar76 = vcmpps_avx512vl(auVar106,ZEXT1632(auVar89),2);
            auVar250._8_4_ = 0xff800000;
            auVar250._0_8_ = 0xff800000ff800000;
            auVar250._12_4_ = 0xff800000;
            auVar250._16_4_ = 0xff800000;
            auVar250._20_4_ = 0xff800000;
            auVar250._24_4_ = 0xff800000;
            auVar250._28_4_ = 0xff800000;
            auVar254._8_4_ = 0x7f800000;
            auVar254._0_8_ = 0x7f8000007f800000;
            auVar254._12_4_ = 0x7f800000;
            auVar254._16_4_ = 0x7f800000;
            auVar254._20_4_ = 0x7f800000;
            auVar254._24_4_ = 0x7f800000;
            auVar254._28_4_ = 0x7f800000;
            auVar104 = vblendmps_avx512vl(auVar254,auVar250);
            bVar79 = (byte)uVar76;
            uVar85 = (uint)(bVar79 & 1) * auVar104._0_4_ |
                     (uint)!(bool)(bVar79 & 1) * auVar100._0_4_;
            bVar6 = (bool)((byte)(uVar76 >> 1) & 1);
            uVar144 = (uint)bVar6 * auVar104._4_4_ | (uint)!bVar6 * auVar100._4_4_;
            bVar6 = (bool)((byte)(uVar76 >> 2) & 1);
            uVar145 = (uint)bVar6 * auVar104._8_4_ | (uint)!bVar6 * auVar100._8_4_;
            bVar6 = (bool)((byte)(uVar76 >> 3) & 1);
            uVar146 = (uint)bVar6 * auVar104._12_4_ | (uint)!bVar6 * auVar100._12_4_;
            bVar6 = (bool)((byte)(uVar76 >> 4) & 1);
            uVar147 = (uint)bVar6 * auVar104._16_4_ | (uint)!bVar6 * auVar100._16_4_;
            bVar6 = (bool)((byte)(uVar76 >> 5) & 1);
            uVar148 = (uint)bVar6 * auVar104._20_4_ | (uint)!bVar6 * auVar100._20_4_;
            bVar6 = (bool)((byte)(uVar76 >> 6) & 1);
            uVar149 = (uint)bVar6 * auVar104._24_4_ | (uint)!bVar6 * auVar100._24_4_;
            bVar6 = SUB81(uVar76 >> 7,0);
            uVar150 = (uint)bVar6 * auVar104._28_4_ | (uint)!bVar6 * auVar100._28_4_;
            auVar135._0_4_ = (bVar77 & 1) * uVar85 | !(bool)(bVar77 & 1) * auVar135._0_4_;
            bVar6 = (bool)((byte)(uVar84 >> 1) & 1);
            auVar135._4_4_ = bVar6 * uVar144 | !bVar6 * auVar135._4_4_;
            bVar6 = (bool)((byte)(uVar84 >> 2) & 1);
            auVar135._8_4_ = bVar6 * uVar145 | !bVar6 * auVar135._8_4_;
            bVar6 = (bool)((byte)(uVar84 >> 3) & 1);
            auVar135._12_4_ = bVar6 * uVar146 | !bVar6 * auVar135._12_4_;
            bVar6 = (bool)((byte)(uVar84 >> 4) & 1);
            auVar135._16_4_ = bVar6 * uVar147 | !bVar6 * auVar135._16_4_;
            bVar6 = (bool)((byte)(uVar84 >> 5) & 1);
            auVar135._20_4_ = bVar6 * uVar148 | !bVar6 * auVar135._20_4_;
            bVar6 = (bool)((byte)(uVar84 >> 6) & 1);
            auVar135._24_4_ = bVar6 * uVar149 | !bVar6 * auVar135._24_4_;
            bVar6 = SUB81(uVar84 >> 7,0);
            auVar135._28_4_ = bVar6 * uVar150 | !bVar6 * auVar135._28_4_;
            auVar104 = vblendmps_avx512vl(auVar250,auVar254);
            bVar6 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar9 = (bool)((byte)(uVar76 >> 4) & 1);
            bVar10 = (bool)((byte)(uVar76 >> 5) & 1);
            bVar11 = (bool)((byte)(uVar76 >> 6) & 1);
            bVar12 = SUB81(uVar76 >> 7,0);
            auVar136._0_4_ =
                 (uint)(bVar77 & 1) *
                 ((uint)(bVar79 & 1) * auVar104._0_4_ | !(bool)(bVar79 & 1) * uVar85) |
                 !(bool)(bVar77 & 1) * auVar136._0_4_;
            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
            auVar136._4_4_ =
                 (uint)bVar83 * ((uint)bVar6 * auVar104._4_4_ | !bVar6 * uVar144) |
                 !bVar83 * auVar136._4_4_;
            bVar6 = (bool)((byte)(uVar84 >> 2) & 1);
            auVar136._8_4_ =
                 (uint)bVar6 * ((uint)bVar7 * auVar104._8_4_ | !bVar7 * uVar145) |
                 !bVar6 * auVar136._8_4_;
            bVar6 = (bool)((byte)(uVar84 >> 3) & 1);
            auVar136._12_4_ =
                 (uint)bVar6 * ((uint)bVar8 * auVar104._12_4_ | !bVar8 * uVar146) |
                 !bVar6 * auVar136._12_4_;
            bVar6 = (bool)((byte)(uVar84 >> 4) & 1);
            auVar136._16_4_ =
                 (uint)bVar6 * ((uint)bVar9 * auVar104._16_4_ | !bVar9 * uVar147) |
                 !bVar6 * auVar136._16_4_;
            bVar6 = (bool)((byte)(uVar84 >> 5) & 1);
            auVar136._20_4_ =
                 (uint)bVar6 * ((uint)bVar10 * auVar104._20_4_ | !bVar10 * uVar148) |
                 !bVar6 * auVar136._20_4_;
            bVar6 = (bool)((byte)(uVar84 >> 6) & 1);
            auVar136._24_4_ =
                 (uint)bVar6 * ((uint)bVar11 * auVar104._24_4_ | !bVar11 * uVar149) |
                 !bVar6 * auVar136._24_4_;
            bVar6 = SUB81(uVar84 >> 7,0);
            auVar136._28_4_ =
                 (uint)bVar6 * ((uint)bVar12 * auVar104._28_4_ | !bVar12 * uVar150) |
                 !bVar6 * auVar136._28_4_;
            bVar80 = (~bVar77 | bVar79) & bVar80;
          }
        }
        auVar103 = vmulps_avx512vl(local_8c0,auVar103);
        auVar102 = vfmadd231ps_avx512vl(auVar103,auVar99,auVar102);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar108);
        _local_1c0 = _local_720;
        local_1a0 = vminps_avx(local_460,auVar135);
        auVar239._8_4_ = 0x7fffffff;
        auVar239._0_8_ = 0x7fffffff7fffffff;
        auVar239._12_4_ = 0x7fffffff;
        auVar239._16_4_ = 0x7fffffff;
        auVar239._20_4_ = 0x7fffffff;
        auVar239._24_4_ = 0x7fffffff;
        auVar239._28_4_ = 0x7fffffff;
        auVar102 = vandps_avx(auVar102,auVar239);
        auVar230 = ZEXT3264(auVar102);
        _local_6c0 = vmaxps_avx(_local_720,auVar136);
        _local_480 = _local_6c0;
        auVar207._8_4_ = 0x3e99999a;
        auVar207._0_8_ = 0x3e99999a3e99999a;
        auVar207._12_4_ = 0x3e99999a;
        auVar207._16_4_ = 0x3e99999a;
        auVar207._20_4_ = 0x3e99999a;
        auVar207._24_4_ = 0x3e99999a;
        auVar207._28_4_ = 0x3e99999a;
        uVar15 = vcmpps_avx512vl(auVar102,auVar207,1);
        uVar17 = vcmpps_avx512vl(_local_720,local_1a0,2);
        bVar77 = (byte)uVar17 & bVar73;
        uVar16 = vcmpps_avx512vl(_local_6c0,local_460,2);
        if ((bVar73 & ((byte)uVar16 | (byte)uVar17)) == 0) {
          auVar220 = ZEXT3264(_DAT_02020f20);
        }
        else {
          auVar102 = vmulps_avx512vl(local_8c0,auVar107);
          auVar102 = vfmadd213ps_avx512vl(auVar97,auVar99,auVar102);
          auVar102 = vfmadd213ps_avx512vl(auVar96,auVar101,auVar102);
          auVar102 = vandps_avx(auVar102,auVar239);
          uVar17 = vcmpps_avx512vl(auVar102,auVar207,1);
          bVar79 = (byte)uVar17 | ~bVar80;
          auVar165._8_4_ = 2;
          auVar165._0_8_ = 0x200000002;
          auVar165._12_4_ = 2;
          auVar165._16_4_ = 2;
          auVar165._20_4_ = 2;
          auVar165._24_4_ = 2;
          auVar165._28_4_ = 2;
          auVar30._8_4_ = 3;
          auVar30._0_8_ = 0x300000003;
          auVar30._12_4_ = 3;
          auVar30._16_4_ = 3;
          auVar30._20_4_ = 3;
          auVar30._24_4_ = 3;
          auVar30._28_4_ = 3;
          auVar102 = vpblendmd_avx512vl(auVar165,auVar30);
          local_440._0_4_ = (uint)(bVar79 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar79 & 1) * 2;
          bVar6 = (bool)(bVar79 >> 1 & 1);
          local_440._4_4_ = (uint)bVar6 * auVar102._4_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar79 >> 2 & 1);
          local_440._8_4_ = (uint)bVar6 * auVar102._8_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar79 >> 3 & 1);
          local_440._12_4_ = (uint)bVar6 * auVar102._12_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar79 >> 4 & 1);
          local_440._16_4_ = (uint)bVar6 * auVar102._16_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar79 >> 5 & 1);
          local_440._20_4_ = (uint)bVar6 * auVar102._20_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar79 >> 6 & 1);
          local_440._24_4_ = (uint)bVar6 * auVar102._24_4_ | (uint)!bVar6 * 2;
          local_440._28_4_ = (uint)(bVar79 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar79 >> 7) * 2;
          local_5e0 = vpbroadcastd_avx512vl();
          uVar17 = vpcmpd_avx512vl(local_5e0,local_440,5);
          bVar79 = (byte)uVar17 & bVar77;
          auVar221._8_4_ = 0x7fffffff;
          auVar221._0_8_ = 0x7fffffff7fffffff;
          auVar221._12_4_ = 0x7fffffff;
          auVar230 = ZEXT1664(auVar221);
          if (bVar79 != 0) {
            auVar89 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar86 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar90 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar91 = vminps_avx(auVar89,auVar90);
            auVar89 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar90 = vmaxps_avx(auVar86,auVar89);
            auVar86 = vandps_avx(auVar91,auVar221);
            auVar89 = vandps_avx(auVar90,auVar221);
            auVar86 = vmaxps_avx(auVar86,auVar89);
            auVar89 = vmovshdup_avx(auVar86);
            auVar89 = vmaxss_avx(auVar89,auVar86);
            auVar86 = vshufpd_avx(auVar86,auVar86,1);
            auVar86 = vmaxss_avx(auVar86,auVar89);
            fVar151 = auVar86._0_4_ * 1.9073486e-06;
            local_820 = vshufps_avx(auVar90,auVar90,0xff);
            local_6a0 = (float)local_720._0_4_ + (float)local_700._0_4_;
            fStack_69c = (float)local_720._4_4_ + (float)local_700._4_4_;
            fStack_698 = fStack_718 + fStack_6f8;
            fStack_694 = fStack_714 + fStack_6f4;
            fStack_690 = fStack_710 + fStack_6f0;
            fStack_68c = fStack_70c + fStack_6ec;
            fStack_688 = fStack_708 + fStack_6e8;
            fStack_684 = fStack_704 + fStack_6e4;
            do {
              auVar166._8_4_ = 0x7f800000;
              auVar166._0_8_ = 0x7f8000007f800000;
              auVar166._12_4_ = 0x7f800000;
              auVar166._16_4_ = 0x7f800000;
              auVar166._20_4_ = 0x7f800000;
              auVar166._24_4_ = 0x7f800000;
              auVar166._28_4_ = 0x7f800000;
              auVar102 = vblendmps_avx512vl(auVar166,_local_720);
              auVar137._0_4_ =
                   (uint)(bVar79 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
              bVar6 = (bool)(bVar79 >> 1 & 1);
              auVar137._4_4_ = (uint)bVar6 * auVar102._4_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar79 >> 2 & 1);
              auVar137._8_4_ = (uint)bVar6 * auVar102._8_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar79 >> 3 & 1);
              auVar137._12_4_ = (uint)bVar6 * auVar102._12_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar79 >> 4 & 1);
              auVar137._16_4_ = (uint)bVar6 * auVar102._16_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar79 >> 5 & 1);
              auVar137._20_4_ = (uint)bVar6 * auVar102._20_4_ | (uint)!bVar6 * 0x7f800000;
              auVar137._24_4_ =
                   (uint)(bVar79 >> 6) * auVar102._24_4_ | (uint)!(bool)(bVar79 >> 6) * 0x7f800000;
              auVar137._28_4_ = 0x7f800000;
              auVar102 = vshufps_avx(auVar137,auVar137,0xb1);
              auVar102 = vminps_avx(auVar137,auVar102);
              auVar103 = vshufpd_avx(auVar102,auVar102,5);
              auVar102 = vminps_avx(auVar102,auVar103);
              auVar103 = vpermpd_avx2(auVar102,0x4e);
              auVar102 = vminps_avx(auVar102,auVar103);
              uVar17 = vcmpps_avx512vl(auVar137,auVar102,0);
              bVar74 = (byte)uVar17 & bVar79;
              bVar75 = bVar79;
              if (bVar74 != 0) {
                bVar75 = bVar74;
              }
              iVar18 = 0;
              for (uVar85 = (uint)bVar75; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                iVar18 = iVar18 + 1;
              }
              fVar240 = *(float *)(local_660 + (uint)(iVar18 << 2));
              fVar242 = *(float *)(local_1c0 + (uint)(iVar18 << 2));
              fVar244 = auVar13._0_4_;
              if ((float)local_860._0_4_ < 0.0) {
                fVar244 = sqrtf((float)local_860._0_4_);
              }
              lVar82 = 4;
              do {
                auVar152._4_4_ = fVar242;
                auVar152._0_4_ = fVar242;
                auVar152._8_4_ = fVar242;
                auVar152._12_4_ = fVar242;
                auVar89 = vfmadd132ps_fma(auVar152,ZEXT816(0) << 0x40,local_850);
                fVar252 = 1.0 - fVar240;
                auVar193._0_4_ = local_780._0_4_ * fVar240;
                auVar193._4_4_ = local_780._4_4_ * fVar240;
                auVar193._8_4_ = local_780._8_4_ * fVar240;
                auVar193._12_4_ = local_780._12_4_ * fVar240;
                local_7c0 = ZEXT416((uint)fVar252);
                auVar215._4_4_ = fVar252;
                auVar215._0_4_ = fVar252;
                auVar215._8_4_ = fVar252;
                auVar215._12_4_ = fVar252;
                auVar86 = vfmadd231ps_fma(auVar193,auVar215,local_740._0_16_);
                auVar222._0_4_ = local_760._0_4_ * fVar240;
                auVar222._4_4_ = local_760._4_4_ * fVar240;
                auVar222._8_4_ = local_760._8_4_ * fVar240;
                auVar222._12_4_ = local_760._12_4_ * fVar240;
                auVar90 = vfmadd231ps_fma(auVar222,auVar215,local_780._0_16_);
                auVar233._0_4_ = fVar240 * (float)local_7a0._0_4_;
                auVar233._4_4_ = fVar240 * (float)local_7a0._4_4_;
                auVar233._8_4_ = fVar240 * fStack_798;
                auVar233._12_4_ = fVar240 * fStack_794;
                auVar91 = vfmadd231ps_fma(auVar233,auVar215,local_760._0_16_);
                auVar237._0_4_ = fVar240 * auVar90._0_4_;
                auVar237._4_4_ = fVar240 * auVar90._4_4_;
                auVar237._8_4_ = fVar240 * auVar90._8_4_;
                auVar237._12_4_ = fVar240 * auVar90._12_4_;
                auVar86 = vfmadd231ps_fma(auVar237,auVar215,auVar86);
                auVar194._0_4_ = fVar240 * auVar91._0_4_;
                auVar194._4_4_ = fVar240 * auVar91._4_4_;
                auVar194._8_4_ = fVar240 * auVar91._8_4_;
                auVar194._12_4_ = fVar240 * auVar91._12_4_;
                auVar90 = vfmadd231ps_fma(auVar194,auVar215,auVar90);
                auVar223._0_4_ = fVar240 * auVar90._0_4_;
                auVar223._4_4_ = fVar240 * auVar90._4_4_;
                auVar223._8_4_ = fVar240 * auVar90._8_4_;
                auVar223._12_4_ = fVar240 * auVar90._12_4_;
                auVar91 = vfmadd231ps_fma(auVar223,auVar86,auVar215);
                auVar86 = vsubps_avx(auVar90,auVar86);
                auVar19._8_4_ = 0x40400000;
                auVar19._0_8_ = 0x4040000040400000;
                auVar19._12_4_ = 0x40400000;
                auVar90 = vmulps_avx512vl(auVar86,auVar19);
                local_6e0._0_16_ = auVar91;
                auVar86 = vsubps_avx(auVar89,auVar91);
                local_880._0_16_ = auVar86;
                auVar86 = vdpps_avx(auVar86,auVar86,0x7f);
                local_8a0._0_16_ = auVar86;
                local_9e0 = ZEXT416((uint)fVar240);
                if (auVar86._0_4_ < 0.0) {
                  auVar230._0_4_ = sqrtf(auVar86._0_4_);
                  auVar230._4_60_ = extraout_var;
                  auVar86 = auVar230._0_16_;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                }
                local_7d0 = vdpps_avx(auVar90,auVar90,0x7f);
                fVar252 = local_7d0._0_4_;
                auVar195._4_12_ = ZEXT812(0) << 0x20;
                auVar195._0_4_ = fVar252;
                auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar195);
                fVar246 = auVar89._0_4_;
                local_7e0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar195);
                auVar20._8_4_ = 0x80000000;
                auVar20._0_8_ = 0x8000000080000000;
                auVar20._12_4_ = 0x80000000;
                auVar91 = vxorps_avx512vl(local_7d0,auVar20);
                auVar89 = vfnmadd213ss_fma(local_7e0,local_7d0,ZEXT416(0x40000000));
                uVar85 = auVar86._0_4_;
                if (fVar252 < auVar91._0_4_) {
                  fVar247 = sqrtf(fVar252);
                  auVar86 = ZEXT416(uVar85);
                }
                else {
                  auVar91 = vsqrtss_avx(local_7d0,local_7d0);
                  fVar247 = auVar91._0_4_;
                }
                fVar252 = fVar246 * 1.5 + fVar252 * -0.5 * fVar246 * fVar246 * fVar246;
                auVar153._0_4_ = auVar90._0_4_ * fVar252;
                auVar153._4_4_ = auVar90._4_4_ * fVar252;
                auVar153._8_4_ = auVar90._8_4_ * fVar252;
                auVar153._12_4_ = auVar90._12_4_ * fVar252;
                auVar91 = vdpps_avx(local_880._0_16_,auVar153,0x7f);
                fVar248 = auVar86._0_4_;
                fVar246 = auVar91._0_4_;
                auVar154._0_4_ = fVar246 * fVar246;
                auVar154._4_4_ = auVar91._4_4_ * auVar91._4_4_;
                auVar154._8_4_ = auVar91._8_4_ * auVar91._8_4_;
                auVar154._12_4_ = auVar91._12_4_ * auVar91._12_4_;
                auVar87 = vsubps_avx512vl(local_8a0._0_16_,auVar154);
                fVar213 = auVar87._0_4_;
                auVar172._4_12_ = ZEXT812(0) << 0x20;
                auVar172._0_4_ = fVar213;
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar172);
                auVar93 = vmulss_avx512f(auVar92,ZEXT416(0x3fc00000));
                auVar94 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
                if (fVar213 < 0.0) {
                  local_800 = fVar252;
                  fStack_7fc = fVar252;
                  fStack_7f8 = fVar252;
                  fStack_7f4 = fVar252;
                  local_7f0 = auVar92;
                  fVar213 = sqrtf(fVar213);
                  auVar94 = ZEXT416(auVar94._0_4_);
                  auVar93 = ZEXT416(auVar93._0_4_);
                  auVar86 = ZEXT416(uVar85);
                  auVar92 = local_7f0;
                  fVar252 = local_800;
                  fVar241 = fStack_7fc;
                  fVar243 = fStack_7f8;
                  fVar245 = fStack_7f4;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                  fVar213 = auVar87._0_4_;
                  fVar241 = fVar252;
                  fVar243 = fVar252;
                  fVar245 = fVar252;
                }
                auVar258 = ZEXT3264(local_8c0);
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9e0,local_7c0);
                fVar171 = auVar87._0_4_ * 6.0;
                fVar14 = fVar240 * 6.0;
                auVar196._0_4_ = fVar14 * (float)local_7a0._0_4_;
                auVar196._4_4_ = fVar14 * (float)local_7a0._4_4_;
                auVar196._8_4_ = fVar14 * fStack_798;
                auVar196._12_4_ = fVar14 * fStack_794;
                auVar173._4_4_ = fVar171;
                auVar173._0_4_ = fVar171;
                auVar173._8_4_ = fVar171;
                auVar173._12_4_ = fVar171;
                auVar87 = vfmadd132ps_fma(auVar173,auVar196,local_760._0_16_);
                auVar231 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7c0,local_9e0);
                fVar171 = auVar231._0_4_ * 6.0;
                auVar197._4_4_ = fVar171;
                auVar197._0_4_ = fVar171;
                auVar197._8_4_ = fVar171;
                auVar197._12_4_ = fVar171;
                auVar87 = vfmadd132ps_fma(auVar197,auVar87,local_780._0_16_);
                fVar171 = local_7c0._0_4_ * 6.0;
                auVar174._4_4_ = fVar171;
                auVar174._0_4_ = fVar171;
                auVar174._8_4_ = fVar171;
                auVar174._12_4_ = fVar171;
                auVar87 = vfmadd132ps_fma(auVar174,auVar87,local_740._0_16_);
                auVar198._0_4_ = auVar87._0_4_ * (float)local_7d0._0_4_;
                auVar198._4_4_ = auVar87._4_4_ * (float)local_7d0._0_4_;
                auVar198._8_4_ = auVar87._8_4_ * (float)local_7d0._0_4_;
                auVar198._12_4_ = auVar87._12_4_ * (float)local_7d0._0_4_;
                auVar87 = vdpps_avx(auVar90,auVar87,0x7f);
                fVar171 = auVar87._0_4_;
                auVar175._0_4_ = auVar90._0_4_ * fVar171;
                auVar175._4_4_ = auVar90._4_4_ * fVar171;
                auVar175._8_4_ = auVar90._8_4_ * fVar171;
                auVar175._12_4_ = auVar90._12_4_ * fVar171;
                auVar87 = vsubps_avx(auVar198,auVar175);
                fVar171 = auVar89._0_4_ * (float)local_7e0._0_4_;
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar139._16_16_ = local_8c0._16_16_;
                auVar95 = vxorps_avx512vl(auVar90,auVar21);
                auVar224._0_4_ = fVar252 * auVar87._0_4_ * fVar171;
                auVar224._4_4_ = fVar241 * auVar87._4_4_ * fVar171;
                auVar224._8_4_ = fVar243 * auVar87._8_4_ * fVar171;
                auVar224._12_4_ = fVar245 * auVar87._12_4_ * fVar171;
                auVar89 = vdpps_avx(auVar95,auVar153,0x7f);
                auVar231 = vmaxss_avx(ZEXT416((uint)fVar151),
                                      ZEXT416((uint)(fVar242 * fVar244 * 1.9073486e-06)));
                auVar87 = vdpps_avx(local_880._0_16_,auVar224,0x7f);
                auVar86 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar151),auVar231);
                auVar232 = vfmadd213ss_fma(ZEXT416((uint)(fVar248 + 1.0)),
                                           ZEXT416((uint)(fVar151 / fVar247)),auVar86);
                auVar86 = vdpps_avx(local_850,auVar153,0x7f);
                fVar252 = auVar89._0_4_ + auVar87._0_4_;
                auVar89 = vdpps_avx(local_880._0_16_,auVar95,0x7f);
                auVar87 = vmulss_avx512f(auVar94,auVar92);
                auVar94 = vmulss_avx512f(auVar92,auVar92);
                auVar92 = vdpps_avx(local_880._0_16_,local_850,0x7f);
                auVar94 = vaddss_avx512f(auVar93,ZEXT416((uint)(auVar87._0_4_ * auVar94._0_4_)));
                auVar87 = vfnmadd231ss_fma(auVar89,auVar91,ZEXT416((uint)fVar252));
                auVar93 = vfnmadd231ss_fma(auVar92,auVar91,auVar86);
                auVar89 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar213 = fVar213 - auVar89._0_4_;
                auVar89 = vshufps_avx(auVar90,auVar90,0xff);
                auVar92 = vfmsub213ss_fma(auVar87,auVar94,auVar89);
                fVar247 = auVar93._0_4_ * auVar94._0_4_;
                auVar87 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar92._0_4_)),
                                          ZEXT416((uint)fVar252),ZEXT416((uint)fVar247));
                fVar248 = auVar87._0_4_;
                fVar240 = fVar240 - (fVar246 * (fVar247 / fVar248) -
                                    fVar213 * (auVar86._0_4_ / fVar248));
                fVar242 = fVar242 - (fVar213 * (fVar252 / fVar248) -
                                    fVar246 * (auVar92._0_4_ / fVar248));
                auVar225._8_4_ = 0x7fffffff;
                auVar225._0_8_ = 0x7fffffff7fffffff;
                auVar225._12_4_ = 0x7fffffff;
                auVar230 = ZEXT1664(auVar225);
                auVar86 = vandps_avx(auVar91,auVar225);
                if (auVar232._0_4_ <= auVar86._0_4_) {
LAB_01d7a64e:
                  bVar6 = false;
                }
                else {
                  auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar232._0_4_ + auVar231._0_4_)),
                                            local_820,ZEXT416(0x36000000));
                  auVar86 = vandps_avx(ZEXT416((uint)fVar213),auVar225);
                  if (auVar91._0_4_ <= auVar86._0_4_) goto LAB_01d7a64e;
                  fVar242 = fVar242 + (float)local_810._0_4_;
                  bVar6 = true;
                  if ((((fVar214 <= fVar242) &&
                       (fVar252 = *(float *)(ray + k * 4 + 0x100), fVar242 <= fVar252)) &&
                      (0.0 <= fVar240)) && (fVar240 <= 1.0)) {
                    auVar139._0_16_ = ZEXT816(0) << 0x20;
                    auVar138._4_28_ = auVar139._4_28_;
                    auVar138._0_4_ = local_8a0._0_4_;
                    auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar138._0_16_);
                    fVar246 = auVar86._0_4_;
                    auVar86 = vmulss_avx512f(local_8a0._0_16_,ZEXT416(0xbf000000));
                    pGVar3 = (context->scene->geometries).items[uVar81].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar246 = fVar246 * 1.5 + auVar86._0_4_ * fVar246 * fVar246 * fVar246;
                      auVar176._0_4_ = local_880._0_4_ * fVar246;
                      auVar176._4_4_ = local_880._4_4_ * fVar246;
                      auVar176._8_4_ = local_880._8_4_ * fVar246;
                      auVar176._12_4_ = local_880._12_4_ * fVar246;
                      auVar91 = vfmadd213ps_fma(auVar89,auVar176,auVar90);
                      auVar86 = vshufps_avx(auVar176,auVar176,0xc9);
                      auVar89 = vshufps_avx(auVar90,auVar90,0xc9);
                      auVar177._0_4_ = auVar176._0_4_ * auVar89._0_4_;
                      auVar177._4_4_ = auVar176._4_4_ * auVar89._4_4_;
                      auVar177._8_4_ = auVar176._8_4_ * auVar89._8_4_;
                      auVar177._12_4_ = auVar176._12_4_ * auVar89._12_4_;
                      auVar90 = vfmsub231ps_fma(auVar177,auVar90,auVar86);
                      auVar86 = vshufps_avx(auVar90,auVar90,0xc9);
                      auVar89 = vshufps_avx(auVar91,auVar91,0xc9);
                      auVar90 = vshufps_avx(auVar90,auVar90,0xd2);
                      auVar155._0_4_ = auVar91._0_4_ * auVar90._0_4_;
                      auVar155._4_4_ = auVar91._4_4_ * auVar90._4_4_;
                      auVar155._8_4_ = auVar91._8_4_ * auVar90._8_4_;
                      auVar155._12_4_ = auVar91._12_4_ * auVar90._12_4_;
                      auVar86 = vfmsub231ps_fma(auVar155,auVar86,auVar89);
                      uVar251 = auVar86._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar242;
                        uVar2 = vextractps_avx(auVar86,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar2;
                        uVar2 = vextractps_avx(auVar86,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar2;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar251;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar240;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(int *)(ray + k * 4 + 0x220) = (int)local_8c8;
                        *(uint *)(ray + k * 4 + 0x240) = uVar81;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar4 = context->user;
                        auVar208._8_4_ = 1;
                        auVar208._0_8_ = 0x100000001;
                        auVar208._12_4_ = 1;
                        auVar208._16_4_ = 1;
                        auVar208._20_4_ = 1;
                        auVar208._24_4_ = 1;
                        auVar208._28_4_ = 1;
                        auVar102 = vpermps_avx2(auVar208,ZEXT1632(auVar86));
                        auVar217._8_4_ = 2;
                        auVar217._0_8_ = 0x200000002;
                        auVar217._12_4_ = 2;
                        auVar217._16_4_ = 2;
                        auVar217._20_4_ = 2;
                        auVar217._24_4_ = 2;
                        auVar217._28_4_ = 2;
                        local_580 = vpermps_avx2(auVar217,ZEXT1632(auVar86));
                        local_5a0[0] = (RTCHitN)auVar102[0];
                        local_5a0[1] = (RTCHitN)auVar102[1];
                        local_5a0[2] = (RTCHitN)auVar102[2];
                        local_5a0[3] = (RTCHitN)auVar102[3];
                        local_5a0[4] = (RTCHitN)auVar102[4];
                        local_5a0[5] = (RTCHitN)auVar102[5];
                        local_5a0[6] = (RTCHitN)auVar102[6];
                        local_5a0[7] = (RTCHitN)auVar102[7];
                        local_5a0[8] = (RTCHitN)auVar102[8];
                        local_5a0[9] = (RTCHitN)auVar102[9];
                        local_5a0[10] = (RTCHitN)auVar102[10];
                        local_5a0[0xb] = (RTCHitN)auVar102[0xb];
                        local_5a0[0xc] = (RTCHitN)auVar102[0xc];
                        local_5a0[0xd] = (RTCHitN)auVar102[0xd];
                        local_5a0[0xe] = (RTCHitN)auVar102[0xe];
                        local_5a0[0xf] = (RTCHitN)auVar102[0xf];
                        local_5a0[0x10] = (RTCHitN)auVar102[0x10];
                        local_5a0[0x11] = (RTCHitN)auVar102[0x11];
                        local_5a0[0x12] = (RTCHitN)auVar102[0x12];
                        local_5a0[0x13] = (RTCHitN)auVar102[0x13];
                        local_5a0[0x14] = (RTCHitN)auVar102[0x14];
                        local_5a0[0x15] = (RTCHitN)auVar102[0x15];
                        local_5a0[0x16] = (RTCHitN)auVar102[0x16];
                        local_5a0[0x17] = (RTCHitN)auVar102[0x17];
                        local_5a0[0x18] = (RTCHitN)auVar102[0x18];
                        local_5a0[0x19] = (RTCHitN)auVar102[0x19];
                        local_5a0[0x1a] = (RTCHitN)auVar102[0x1a];
                        local_5a0[0x1b] = (RTCHitN)auVar102[0x1b];
                        local_5a0[0x1c] = (RTCHitN)auVar102[0x1c];
                        local_5a0[0x1d] = (RTCHitN)auVar102[0x1d];
                        local_5a0[0x1e] = (RTCHitN)auVar102[0x1e];
                        local_5a0[0x1f] = (RTCHitN)auVar102[0x1f];
                        local_560 = uVar251;
                        uStack_55c = uVar251;
                        uStack_558 = uVar251;
                        uStack_554 = uVar251;
                        uStack_550 = uVar251;
                        uStack_54c = uVar251;
                        uStack_548 = uVar251;
                        uStack_544 = uVar251;
                        local_540 = fVar240;
                        fStack_53c = fVar240;
                        fStack_538 = fVar240;
                        fStack_534 = fVar240;
                        fStack_530 = fVar240;
                        fStack_52c = fVar240;
                        fStack_528 = fVar240;
                        fStack_524 = fVar240;
                        local_520 = ZEXT432(0) << 0x20;
                        local_500 = local_620._0_8_;
                        uStack_4f8 = local_620._8_8_;
                        uStack_4f0 = local_620._16_8_;
                        uStack_4e8 = local_620._24_8_;
                        local_4e0 = local_600;
                        auVar102 = vpcmpeqd_avx2(local_600,local_600);
                        local_8e8[1] = auVar102;
                        *local_8e8 = auVar102;
                        local_4c0 = pRVar4->instID[0];
                        uStack_4bc = local_4c0;
                        uStack_4b8 = local_4c0;
                        uStack_4b4 = local_4c0;
                        uStack_4b0 = local_4c0;
                        uStack_4ac = local_4c0;
                        uStack_4a8 = local_4c0;
                        uStack_4a4 = local_4c0;
                        local_4a0 = pRVar4->instPrimID[0];
                        uStack_49c = local_4a0;
                        uStack_498 = local_4a0;
                        uStack_494 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_48c = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_484 = local_4a0;
                        *(float *)(ray + k * 4 + 0x100) = fVar242;
                        local_840 = local_640._0_8_;
                        uStack_838 = local_640._8_8_;
                        uStack_830 = local_640._16_8_;
                        uStack_828 = local_640._24_8_;
                        local_930.valid = (int *)&local_840;
                        local_930.geometryUserPtr = pGVar3->userPtr;
                        local_930.context = context->user;
                        local_930.hit = local_5a0;
                        local_930.N = 8;
                        local_930.ray = (RTCRayN *)ray;
                        if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar3->intersectionFilterN)(&local_930);
                          auVar258 = ZEXT3264(local_8c0);
                          auVar230 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar63._8_8_ = uStack_838;
                        auVar63._0_8_ = local_840;
                        auVar63._16_8_ = uStack_830;
                        auVar63._24_8_ = uStack_828;
                        if (auVar63 != (undefined1  [32])0x0) {
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var5)(&local_930);
                            auVar258 = ZEXT3264(local_8c0);
                            auVar230 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar64._8_8_ = uStack_838;
                          auVar64._0_8_ = local_840;
                          auVar64._16_8_ = uStack_830;
                          auVar64._24_8_ = uStack_828;
                          if (auVar64 != (undefined1  [32])0x0) {
                            uVar84 = vptestmd_avx512vl(auVar64,auVar64);
                            iVar56 = *(int *)(local_930.hit + 4);
                            iVar57 = *(int *)(local_930.hit + 8);
                            iVar58 = *(int *)(local_930.hit + 0xc);
                            iVar59 = *(int *)(local_930.hit + 0x10);
                            iVar60 = *(int *)(local_930.hit + 0x14);
                            iVar61 = *(int *)(local_930.hit + 0x18);
                            iVar62 = *(int *)(local_930.hit + 0x1c);
                            bVar75 = (byte)uVar84;
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar12 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_930.ray + 0x180) =
                                 (uint)(bVar75 & 1) * *(int *)local_930.hit |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_930.ray + 0x180);
                            *(uint *)(local_930.ray + 0x184) =
                                 (uint)bVar83 * iVar56 |
                                 (uint)!bVar83 * *(int *)(local_930.ray + 0x184);
                            *(uint *)(local_930.ray + 0x188) =
                                 (uint)bVar7 * iVar57 |
                                 (uint)!bVar7 * *(int *)(local_930.ray + 0x188);
                            *(uint *)(local_930.ray + 0x18c) =
                                 (uint)bVar8 * iVar58 |
                                 (uint)!bVar8 * *(int *)(local_930.ray + 0x18c);
                            *(uint *)(local_930.ray + 400) =
                                 (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_930.ray + 400)
                            ;
                            *(uint *)(local_930.ray + 0x194) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x194);
                            *(uint *)(local_930.ray + 0x198) =
                                 (uint)bVar11 * iVar61 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x198);
                            *(uint *)(local_930.ray + 0x19c) =
                                 (uint)bVar12 * iVar62 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x19c);
                            iVar56 = *(int *)(local_930.hit + 0x24);
                            iVar57 = *(int *)(local_930.hit + 0x28);
                            iVar58 = *(int *)(local_930.hit + 0x2c);
                            iVar59 = *(int *)(local_930.hit + 0x30);
                            iVar60 = *(int *)(local_930.hit + 0x34);
                            iVar61 = *(int *)(local_930.hit + 0x38);
                            iVar62 = *(int *)(local_930.hit + 0x3c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar12 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_930.ray + 0x1a0) =
                                 (uint)(bVar75 & 1) * *(int *)(local_930.hit + 0x20) |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_930.ray + 0x1a0);
                            *(uint *)(local_930.ray + 0x1a4) =
                                 (uint)bVar83 * iVar56 |
                                 (uint)!bVar83 * *(int *)(local_930.ray + 0x1a4);
                            *(uint *)(local_930.ray + 0x1a8) =
                                 (uint)bVar7 * iVar57 |
                                 (uint)!bVar7 * *(int *)(local_930.ray + 0x1a8);
                            *(uint *)(local_930.ray + 0x1ac) =
                                 (uint)bVar8 * iVar58 |
                                 (uint)!bVar8 * *(int *)(local_930.ray + 0x1ac);
                            *(uint *)(local_930.ray + 0x1b0) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x1b0);
                            *(uint *)(local_930.ray + 0x1b4) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x1b4);
                            *(uint *)(local_930.ray + 0x1b8) =
                                 (uint)bVar11 * iVar61 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x1b8);
                            *(uint *)(local_930.ray + 0x1bc) =
                                 (uint)bVar12 * iVar62 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x1bc);
                            iVar56 = *(int *)(local_930.hit + 0x44);
                            iVar57 = *(int *)(local_930.hit + 0x48);
                            iVar58 = *(int *)(local_930.hit + 0x4c);
                            iVar59 = *(int *)(local_930.hit + 0x50);
                            iVar60 = *(int *)(local_930.hit + 0x54);
                            iVar61 = *(int *)(local_930.hit + 0x58);
                            iVar62 = *(int *)(local_930.hit + 0x5c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar12 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_930.ray + 0x1c0) =
                                 (uint)(bVar75 & 1) * *(int *)(local_930.hit + 0x40) |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_930.ray + 0x1c0);
                            *(uint *)(local_930.ray + 0x1c4) =
                                 (uint)bVar83 * iVar56 |
                                 (uint)!bVar83 * *(int *)(local_930.ray + 0x1c4);
                            *(uint *)(local_930.ray + 0x1c8) =
                                 (uint)bVar7 * iVar57 |
                                 (uint)!bVar7 * *(int *)(local_930.ray + 0x1c8);
                            *(uint *)(local_930.ray + 0x1cc) =
                                 (uint)bVar8 * iVar58 |
                                 (uint)!bVar8 * *(int *)(local_930.ray + 0x1cc);
                            *(uint *)(local_930.ray + 0x1d0) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x1d0);
                            *(uint *)(local_930.ray + 0x1d4) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x1d4);
                            *(uint *)(local_930.ray + 0x1d8) =
                                 (uint)bVar11 * iVar61 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x1d8);
                            *(uint *)(local_930.ray + 0x1dc) =
                                 (uint)bVar12 * iVar62 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x1dc);
                            iVar56 = *(int *)(local_930.hit + 100);
                            iVar57 = *(int *)(local_930.hit + 0x68);
                            iVar58 = *(int *)(local_930.hit + 0x6c);
                            iVar59 = *(int *)(local_930.hit + 0x70);
                            iVar60 = *(int *)(local_930.hit + 0x74);
                            iVar61 = *(int *)(local_930.hit + 0x78);
                            iVar62 = *(int *)(local_930.hit + 0x7c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar12 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_930.ray + 0x1e0) =
                                 (uint)(bVar75 & 1) * *(int *)(local_930.hit + 0x60) |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_930.ray + 0x1e0);
                            *(uint *)(local_930.ray + 0x1e4) =
                                 (uint)bVar83 * iVar56 |
                                 (uint)!bVar83 * *(int *)(local_930.ray + 0x1e4);
                            *(uint *)(local_930.ray + 0x1e8) =
                                 (uint)bVar7 * iVar57 |
                                 (uint)!bVar7 * *(int *)(local_930.ray + 0x1e8);
                            *(uint *)(local_930.ray + 0x1ec) =
                                 (uint)bVar8 * iVar58 |
                                 (uint)!bVar8 * *(int *)(local_930.ray + 0x1ec);
                            *(uint *)(local_930.ray + 0x1f0) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x1f0);
                            *(uint *)(local_930.ray + 500) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 500);
                            *(uint *)(local_930.ray + 0x1f8) =
                                 (uint)bVar11 * iVar61 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x1f8);
                            *(uint *)(local_930.ray + 0x1fc) =
                                 (uint)bVar12 * iVar62 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x1fc);
                            iVar56 = *(int *)(local_930.hit + 0x84);
                            iVar57 = *(int *)(local_930.hit + 0x88);
                            iVar58 = *(int *)(local_930.hit + 0x8c);
                            iVar59 = *(int *)(local_930.hit + 0x90);
                            iVar60 = *(int *)(local_930.hit + 0x94);
                            iVar61 = *(int *)(local_930.hit + 0x98);
                            iVar62 = *(int *)(local_930.hit + 0x9c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar12 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_930.ray + 0x200) =
                                 (uint)(bVar75 & 1) * *(int *)(local_930.hit + 0x80) |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_930.ray + 0x200);
                            *(uint *)(local_930.ray + 0x204) =
                                 (uint)bVar83 * iVar56 |
                                 (uint)!bVar83 * *(int *)(local_930.ray + 0x204);
                            *(uint *)(local_930.ray + 0x208) =
                                 (uint)bVar7 * iVar57 |
                                 (uint)!bVar7 * *(int *)(local_930.ray + 0x208);
                            *(uint *)(local_930.ray + 0x20c) =
                                 (uint)bVar8 * iVar58 |
                                 (uint)!bVar8 * *(int *)(local_930.ray + 0x20c);
                            *(uint *)(local_930.ray + 0x210) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x210);
                            *(uint *)(local_930.ray + 0x214) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x214);
                            *(uint *)(local_930.ray + 0x218) =
                                 (uint)bVar11 * iVar61 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x218);
                            *(uint *)(local_930.ray + 0x21c) =
                                 (uint)bVar12 * iVar62 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x21c);
                            auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0xa0));
                            *(undefined1 (*) [32])(local_930.ray + 0x220) = auVar102;
                            auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0xc0));
                            *(undefined1 (*) [32])(local_930.ray + 0x240) = auVar102;
                            auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0xe0));
                            *(undefined1 (*) [32])(local_930.ray + 0x260) = auVar102;
                            auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0x100));
                            *(undefined1 (*) [32])(local_930.ray + 0x280) = auVar102;
                            goto LAB_01d7a651;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar252;
                      }
                    }
                  }
                }
LAB_01d7a651:
                bVar83 = lVar82 != 0;
                lVar82 = lVar82 + -1;
              } while ((!bVar6) && (bVar83));
              auVar67._4_4_ = fStack_69c;
              auVar67._0_4_ = local_6a0;
              auVar67._8_4_ = fStack_698;
              auVar67._12_4_ = fStack_694;
              auVar67._16_4_ = fStack_690;
              auVar67._20_4_ = fStack_68c;
              auVar67._24_4_ = fStack_688;
              auVar67._28_4_ = fStack_684;
              uVar251 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar31._4_4_ = uVar251;
              auVar31._0_4_ = uVar251;
              auVar31._8_4_ = uVar251;
              auVar31._12_4_ = uVar251;
              auVar31._16_4_ = uVar251;
              auVar31._20_4_ = uVar251;
              auVar31._24_4_ = uVar251;
              auVar31._28_4_ = uVar251;
              uVar17 = vcmpps_avx512vl(auVar67,auVar31,2);
              bVar79 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar79 & (byte)uVar17;
            } while (bVar79 != 0);
          }
          auVar167._0_4_ = (float)local_6c0._0_4_ + (float)local_700._0_4_;
          auVar167._4_4_ = (float)local_6c0._4_4_ + (float)local_700._4_4_;
          auVar167._8_4_ = fStack_6b8 + fStack_6f8;
          auVar167._12_4_ = fStack_6b4 + fStack_6f4;
          auVar167._16_4_ = fStack_6b0 + fStack_6f0;
          auVar167._20_4_ = fStack_6ac + fStack_6ec;
          auVar167._24_4_ = fStack_6a8 + fStack_6e8;
          auVar167._28_4_ = fStack_6a4 + fStack_6e4;
          uVar251 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar32._4_4_ = uVar251;
          auVar32._0_4_ = uVar251;
          auVar32._8_4_ = uVar251;
          auVar32._12_4_ = uVar251;
          auVar32._16_4_ = uVar251;
          auVar32._20_4_ = uVar251;
          auVar32._24_4_ = uVar251;
          auVar32._28_4_ = uVar251;
          uVar17 = vcmpps_avx512vl(auVar167,auVar32,2);
          bVar80 = (byte)uVar15 | ~bVar80;
          bVar73 = (byte)uVar16 & bVar73 & (byte)uVar17;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar33._8_4_ = 3;
          auVar33._0_8_ = 0x300000003;
          auVar33._12_4_ = 3;
          auVar33._16_4_ = 3;
          auVar33._20_4_ = 3;
          auVar33._24_4_ = 3;
          auVar33._28_4_ = 3;
          auVar102 = vpblendmd_avx512vl(auVar168,auVar33);
          local_6c0._0_4_ = (uint)(bVar80 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar80 & 1) * 2;
          bVar6 = (bool)(bVar80 >> 1 & 1);
          local_6c0._4_4_ = (uint)bVar6 * auVar102._4_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar80 >> 2 & 1);
          fStack_6b8 = (float)((uint)bVar6 * auVar102._8_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar80 >> 3 & 1);
          fStack_6b4 = (float)((uint)bVar6 * auVar102._12_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar80 >> 4 & 1);
          fStack_6b0 = (float)((uint)bVar6 * auVar102._16_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar80 >> 5 & 1);
          fStack_6ac = (float)((uint)bVar6 * auVar102._20_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar80 >> 6 & 1);
          fStack_6a8 = (float)((uint)bVar6 * auVar102._24_4_ | (uint)!bVar6 * 2);
          fStack_6a4 = (float)((uint)(bVar80 >> 7) * auVar102._28_4_ |
                              (uint)!(bool)(bVar80 >> 7) * 2);
          uVar15 = vpcmpd_avx512vl(_local_6c0,local_5e0,2);
          bVar80 = (byte)uVar15 & bVar73;
          if (bVar80 != 0) {
            auVar89 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar86 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar90 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar91 = vminps_avx(auVar89,auVar90);
            auVar89 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar90 = vmaxps_avx(auVar86,auVar89);
            auVar86 = vandps_avx(auVar91,auVar230._0_16_);
            auVar89 = vandps_avx(auVar90,auVar230._0_16_);
            auVar86 = vmaxps_avx(auVar86,auVar89);
            auVar89 = vmovshdup_avx(auVar86);
            auVar89 = vmaxss_avx(auVar89,auVar86);
            auVar86 = vshufpd_avx(auVar86,auVar86,1);
            auVar86 = vmaxss_avx(auVar86,auVar89);
            fVar151 = auVar86._0_4_ * 1.9073486e-06;
            local_820 = vshufps_avx(auVar90,auVar90,0xff);
            _local_720 = _local_480;
            local_6a0 = (float)local_480._0_4_ + (float)local_700._0_4_;
            fStack_69c = (float)local_480._4_4_ + (float)local_700._4_4_;
            fStack_698 = fStack_478 + fStack_6f8;
            fStack_694 = fStack_474 + fStack_6f4;
            fStack_690 = fStack_470 + fStack_6f0;
            fStack_68c = fStack_46c + fStack_6ec;
            fStack_688 = fStack_468 + fStack_6e8;
            fStack_684 = fStack_464 + fStack_6e4;
            do {
              auVar169._8_4_ = 0x7f800000;
              auVar169._0_8_ = 0x7f8000007f800000;
              auVar169._12_4_ = 0x7f800000;
              auVar169._16_4_ = 0x7f800000;
              auVar169._20_4_ = 0x7f800000;
              auVar169._24_4_ = 0x7f800000;
              auVar169._28_4_ = 0x7f800000;
              auVar102 = vblendmps_avx512vl(auVar169,_local_720);
              auVar140._0_4_ =
                   (uint)(bVar80 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
              bVar6 = (bool)(bVar80 >> 1 & 1);
              auVar140._4_4_ = (uint)bVar6 * auVar102._4_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar80 >> 2 & 1);
              auVar140._8_4_ = (uint)bVar6 * auVar102._8_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar80 >> 3 & 1);
              auVar140._12_4_ = (uint)bVar6 * auVar102._12_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar80 >> 4 & 1);
              auVar140._16_4_ = (uint)bVar6 * auVar102._16_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar80 >> 5 & 1);
              auVar140._20_4_ = (uint)bVar6 * auVar102._20_4_ | (uint)!bVar6 * 0x7f800000;
              auVar140._24_4_ =
                   (uint)(bVar80 >> 6) * auVar102._24_4_ | (uint)!(bool)(bVar80 >> 6) * 0x7f800000;
              auVar140._28_4_ = 0x7f800000;
              auVar102 = vshufps_avx(auVar140,auVar140,0xb1);
              auVar102 = vminps_avx(auVar140,auVar102);
              auVar103 = vshufpd_avx(auVar102,auVar102,5);
              auVar102 = vminps_avx(auVar102,auVar103);
              auVar103 = vpermpd_avx2(auVar102,0x4e);
              auVar102 = vminps_avx(auVar102,auVar103);
              uVar15 = vcmpps_avx512vl(auVar140,auVar102,0);
              bVar75 = (byte)uVar15 & bVar80;
              bVar79 = bVar80;
              if (bVar75 != 0) {
                bVar79 = bVar75;
              }
              iVar18 = 0;
              for (uVar85 = (uint)bVar79; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                iVar18 = iVar18 + 1;
              }
              fVar240 = *(float *)(local_680 + (uint)(iVar18 << 2));
              fVar242 = *(float *)(local_460 + (uint)(iVar18 << 2));
              fVar244 = auVar88._0_4_;
              if ((float)local_860._0_4_ < 0.0) {
                fVar244 = sqrtf((float)local_860._0_4_);
              }
              lVar82 = 4;
              do {
                auVar156._4_4_ = fVar242;
                auVar156._0_4_ = fVar242;
                auVar156._8_4_ = fVar242;
                auVar156._12_4_ = fVar242;
                auVar89 = vfmadd132ps_fma(auVar156,ZEXT816(0) << 0x40,local_850);
                fVar252 = 1.0 - fVar240;
                auVar199._0_4_ = local_780._0_4_ * fVar240;
                auVar199._4_4_ = local_780._4_4_ * fVar240;
                auVar199._8_4_ = local_780._8_4_ * fVar240;
                auVar199._12_4_ = local_780._12_4_ * fVar240;
                local_7c0 = ZEXT416((uint)fVar252);
                auVar216._4_4_ = fVar252;
                auVar216._0_4_ = fVar252;
                auVar216._8_4_ = fVar252;
                auVar216._12_4_ = fVar252;
                auVar86 = vfmadd231ps_fma(auVar199,auVar216,local_740._0_16_);
                auVar226._0_4_ = local_760._0_4_ * fVar240;
                auVar226._4_4_ = local_760._4_4_ * fVar240;
                auVar226._8_4_ = local_760._8_4_ * fVar240;
                auVar226._12_4_ = local_760._12_4_ * fVar240;
                auVar90 = vfmadd231ps_fma(auVar226,auVar216,local_780._0_16_);
                auVar234._0_4_ = fVar240 * (float)local_7a0._0_4_;
                auVar234._4_4_ = fVar240 * (float)local_7a0._4_4_;
                auVar234._8_4_ = fVar240 * fStack_798;
                auVar234._12_4_ = fVar240 * fStack_794;
                auVar91 = vfmadd231ps_fma(auVar234,auVar216,local_760._0_16_);
                auVar238._0_4_ = fVar240 * auVar90._0_4_;
                auVar238._4_4_ = fVar240 * auVar90._4_4_;
                auVar238._8_4_ = fVar240 * auVar90._8_4_;
                auVar238._12_4_ = fVar240 * auVar90._12_4_;
                auVar86 = vfmadd231ps_fma(auVar238,auVar216,auVar86);
                auVar200._0_4_ = fVar240 * auVar91._0_4_;
                auVar200._4_4_ = fVar240 * auVar91._4_4_;
                auVar200._8_4_ = fVar240 * auVar91._8_4_;
                auVar200._12_4_ = fVar240 * auVar91._12_4_;
                auVar90 = vfmadd231ps_fma(auVar200,auVar216,auVar90);
                auVar227._0_4_ = fVar240 * auVar90._0_4_;
                auVar227._4_4_ = fVar240 * auVar90._4_4_;
                auVar227._8_4_ = fVar240 * auVar90._8_4_;
                auVar227._12_4_ = fVar240 * auVar90._12_4_;
                auVar91 = vfmadd231ps_fma(auVar227,auVar86,auVar216);
                auVar86 = vsubps_avx(auVar90,auVar86);
                auVar22._8_4_ = 0x40400000;
                auVar22._0_8_ = 0x4040000040400000;
                auVar22._12_4_ = 0x40400000;
                auVar90 = vmulps_avx512vl(auVar86,auVar22);
                local_6e0._0_16_ = auVar91;
                auVar86 = vsubps_avx(auVar89,auVar91);
                local_880._0_16_ = auVar86;
                auVar86 = vdpps_avx(auVar86,auVar86,0x7f);
                local_8a0._0_16_ = auVar86;
                local_9e0 = ZEXT416((uint)fVar240);
                if (auVar86._0_4_ < 0.0) {
                  auVar258._0_4_ = sqrtf(auVar86._0_4_);
                  auVar258._4_60_ = extraout_var_00;
                  auVar86 = auVar258._0_16_;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                }
                local_7d0 = vdpps_avx(auVar90,auVar90,0x7f);
                fVar252 = local_7d0._0_4_;
                auVar201._4_12_ = ZEXT812(0) << 0x20;
                auVar201._0_4_ = fVar252;
                auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar201);
                fVar246 = auVar89._0_4_;
                local_7e0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar201);
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar91 = vxorps_avx512vl(local_7d0,auVar23);
                auVar89 = vfnmadd213ss_fma(local_7e0,local_7d0,ZEXT416(0x40000000));
                uVar85 = auVar86._0_4_;
                if (fVar252 < auVar91._0_4_) {
                  fVar247 = sqrtf(fVar252);
                  auVar86 = ZEXT416(uVar85);
                }
                else {
                  auVar91 = vsqrtss_avx(local_7d0,local_7d0);
                  fVar247 = auVar91._0_4_;
                }
                fVar252 = fVar246 * 1.5 + fVar252 * -0.5 * fVar246 * fVar246 * fVar246;
                auVar157._0_4_ = auVar90._0_4_ * fVar252;
                auVar157._4_4_ = auVar90._4_4_ * fVar252;
                auVar157._8_4_ = auVar90._8_4_ * fVar252;
                auVar157._12_4_ = auVar90._12_4_ * fVar252;
                auVar91 = vdpps_avx(local_880._0_16_,auVar157,0x7f);
                fVar248 = auVar86._0_4_;
                fVar246 = auVar91._0_4_;
                auVar158._0_4_ = fVar246 * fVar246;
                auVar158._4_4_ = auVar91._4_4_ * auVar91._4_4_;
                auVar158._8_4_ = auVar91._8_4_ * auVar91._8_4_;
                auVar158._12_4_ = auVar91._12_4_ * auVar91._12_4_;
                auVar87 = vsubps_avx512vl(local_8a0._0_16_,auVar158);
                fVar213 = auVar87._0_4_;
                auVar178._4_12_ = ZEXT812(0) << 0x20;
                auVar178._0_4_ = fVar213;
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
                auVar93 = vmulss_avx512f(auVar92,ZEXT416(0x3fc00000));
                auVar94 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
                if (fVar213 < 0.0) {
                  local_800 = fVar252;
                  fStack_7fc = fVar252;
                  fStack_7f8 = fVar252;
                  fStack_7f4 = fVar252;
                  local_7f0 = auVar92;
                  fVar213 = sqrtf(fVar213);
                  auVar94 = ZEXT416(auVar94._0_4_);
                  auVar93 = ZEXT416(auVar93._0_4_);
                  auVar86 = ZEXT416(uVar85);
                  auVar92 = local_7f0;
                  fVar252 = local_800;
                  fVar241 = fStack_7fc;
                  fVar243 = fStack_7f8;
                  fVar245 = fStack_7f4;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                  fVar213 = auVar87._0_4_;
                  fVar241 = fVar252;
                  fVar243 = fVar252;
                  fVar245 = fVar252;
                }
                auVar258 = ZEXT3264(local_8c0);
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9e0,local_7c0);
                fVar171 = auVar87._0_4_ * 6.0;
                fVar14 = fVar240 * 6.0;
                auVar202._0_4_ = fVar14 * (float)local_7a0._0_4_;
                auVar202._4_4_ = fVar14 * (float)local_7a0._4_4_;
                auVar202._8_4_ = fVar14 * fStack_798;
                auVar202._12_4_ = fVar14 * fStack_794;
                auVar179._4_4_ = fVar171;
                auVar179._0_4_ = fVar171;
                auVar179._8_4_ = fVar171;
                auVar179._12_4_ = fVar171;
                auVar87 = vfmadd132ps_fma(auVar179,auVar202,local_760._0_16_);
                auVar231 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7c0,local_9e0);
                fVar171 = auVar231._0_4_ * 6.0;
                auVar203._4_4_ = fVar171;
                auVar203._0_4_ = fVar171;
                auVar203._8_4_ = fVar171;
                auVar203._12_4_ = fVar171;
                auVar87 = vfmadd132ps_fma(auVar203,auVar87,local_780._0_16_);
                fVar171 = local_7c0._0_4_ * 6.0;
                auVar180._4_4_ = fVar171;
                auVar180._0_4_ = fVar171;
                auVar180._8_4_ = fVar171;
                auVar180._12_4_ = fVar171;
                auVar87 = vfmadd132ps_fma(auVar180,auVar87,local_740._0_16_);
                auVar204._0_4_ = auVar87._0_4_ * (float)local_7d0._0_4_;
                auVar204._4_4_ = auVar87._4_4_ * (float)local_7d0._0_4_;
                auVar204._8_4_ = auVar87._8_4_ * (float)local_7d0._0_4_;
                auVar204._12_4_ = auVar87._12_4_ * (float)local_7d0._0_4_;
                auVar87 = vdpps_avx(auVar90,auVar87,0x7f);
                fVar171 = auVar87._0_4_;
                auVar181._0_4_ = auVar90._0_4_ * fVar171;
                auVar181._4_4_ = auVar90._4_4_ * fVar171;
                auVar181._8_4_ = auVar90._8_4_ * fVar171;
                auVar181._12_4_ = auVar90._12_4_ * fVar171;
                auVar87 = vsubps_avx(auVar204,auVar181);
                fVar171 = auVar89._0_4_ * (float)local_7e0._0_4_;
                auVar24._8_4_ = 0x80000000;
                auVar24._0_8_ = 0x8000000080000000;
                auVar24._12_4_ = 0x80000000;
                auVar142._16_16_ = local_8c0._16_16_;
                auVar95 = vxorps_avx512vl(auVar90,auVar24);
                auVar228._0_4_ = fVar252 * auVar87._0_4_ * fVar171;
                auVar228._4_4_ = fVar241 * auVar87._4_4_ * fVar171;
                auVar228._8_4_ = fVar243 * auVar87._8_4_ * fVar171;
                auVar228._12_4_ = fVar245 * auVar87._12_4_ * fVar171;
                auVar89 = vdpps_avx(auVar95,auVar157,0x7f);
                auVar231 = vmaxss_avx(ZEXT416((uint)fVar151),
                                      ZEXT416((uint)(fVar242 * fVar244 * 1.9073486e-06)));
                auVar87 = vdpps_avx(local_880._0_16_,auVar228,0x7f);
                auVar86 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar151),auVar231);
                auVar232 = vfmadd213ss_fma(ZEXT416((uint)(fVar248 + 1.0)),
                                           ZEXT416((uint)(fVar151 / fVar247)),auVar86);
                auVar86 = vdpps_avx(local_850,auVar157,0x7f);
                fVar252 = auVar89._0_4_ + auVar87._0_4_;
                auVar89 = vdpps_avx(local_880._0_16_,auVar95,0x7f);
                auVar87 = vmulss_avx512f(auVar94,auVar92);
                auVar94 = vmulss_avx512f(auVar92,auVar92);
                auVar92 = vdpps_avx(local_880._0_16_,local_850,0x7f);
                auVar94 = vaddss_avx512f(auVar93,ZEXT416((uint)(auVar87._0_4_ * auVar94._0_4_)));
                auVar87 = vfnmadd231ss_fma(auVar89,auVar91,ZEXT416((uint)fVar252));
                auVar93 = vfnmadd231ss_fma(auVar92,auVar91,auVar86);
                auVar89 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar213 = fVar213 - auVar89._0_4_;
                auVar89 = vshufps_avx(auVar90,auVar90,0xff);
                auVar92 = vfmsub213ss_fma(auVar87,auVar94,auVar89);
                fVar247 = auVar93._0_4_ * auVar94._0_4_;
                auVar87 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar92._0_4_)),
                                          ZEXT416((uint)fVar252),ZEXT416((uint)fVar247));
                fVar248 = auVar87._0_4_;
                fVar240 = fVar240 - (fVar246 * (fVar247 / fVar248) -
                                    fVar213 * (auVar86._0_4_ / fVar248));
                fVar242 = fVar242 - (fVar213 * (fVar252 / fVar248) -
                                    fVar246 * (auVar92._0_4_ / fVar248));
                auVar229._8_4_ = 0x7fffffff;
                auVar229._0_8_ = 0x7fffffff7fffffff;
                auVar229._12_4_ = 0x7fffffff;
                auVar230 = ZEXT1664(auVar229);
                auVar86 = vandps_avx(auVar91,auVar229);
                if (auVar232._0_4_ <= auVar86._0_4_) {
LAB_01d7b170:
                  bVar6 = false;
                }
                else {
                  auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar232._0_4_ + auVar231._0_4_)),
                                            local_820,ZEXT416(0x36000000));
                  auVar86 = vandps_avx(ZEXT416((uint)fVar213),auVar229);
                  if (auVar91._0_4_ <= auVar86._0_4_) goto LAB_01d7b170;
                  fVar242 = fVar242 + (float)local_810._0_4_;
                  bVar6 = true;
                  if (fVar214 <= fVar242) {
                    fVar252 = *(float *)(ray + k * 4 + 0x100);
                    auVar230 = ZEXT464((uint)fVar252);
                    if (((fVar242 <= fVar252) && (0.0 <= fVar240)) && (fVar240 <= 1.0)) {
                      auVar142._0_16_ = ZEXT816(0) << 0x20;
                      auVar141._4_28_ = auVar142._4_28_;
                      auVar141._0_4_ = local_8a0._0_4_;
                      auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar141._0_16_);
                      fVar246 = auVar86._0_4_;
                      auVar86 = vmulss_avx512f(local_8a0._0_16_,ZEXT416(0xbf000000));
                      pGVar3 = (context->scene->geometries).items[uVar81].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                        fVar246 = fVar246 * 1.5 + auVar86._0_4_ * fVar246 * fVar246 * fVar246;
                        auVar182._0_4_ = local_880._0_4_ * fVar246;
                        auVar182._4_4_ = local_880._4_4_ * fVar246;
                        auVar182._8_4_ = local_880._8_4_ * fVar246;
                        auVar182._12_4_ = local_880._12_4_ * fVar246;
                        auVar91 = vfmadd213ps_fma(auVar89,auVar182,auVar90);
                        auVar86 = vshufps_avx(auVar182,auVar182,0xc9);
                        auVar89 = vshufps_avx(auVar90,auVar90,0xc9);
                        auVar183._0_4_ = auVar182._0_4_ * auVar89._0_4_;
                        auVar183._4_4_ = auVar182._4_4_ * auVar89._4_4_;
                        auVar183._8_4_ = auVar182._8_4_ * auVar89._8_4_;
                        auVar183._12_4_ = auVar182._12_4_ * auVar89._12_4_;
                        auVar90 = vfmsub231ps_fma(auVar183,auVar90,auVar86);
                        auVar86 = vshufps_avx(auVar90,auVar90,0xc9);
                        auVar89 = vshufps_avx(auVar91,auVar91,0xc9);
                        auVar90 = vshufps_avx(auVar90,auVar90,0xd2);
                        auVar159._0_4_ = auVar91._0_4_ * auVar90._0_4_;
                        auVar159._4_4_ = auVar91._4_4_ * auVar90._4_4_;
                        auVar159._8_4_ = auVar91._8_4_ * auVar90._8_4_;
                        auVar159._12_4_ = auVar91._12_4_ * auVar90._12_4_;
                        auVar86 = vfmsub231ps_fma(auVar159,auVar86,auVar89);
                        uVar251 = auVar86._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x100) = fVar242;
                          uVar2 = vextractps_avx(auVar86,1);
                          *(undefined4 *)(ray + k * 4 + 0x180) = uVar2;
                          uVar2 = vextractps_avx(auVar86,2);
                          *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar2;
                          *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar251;
                          *(float *)(ray + k * 4 + 0x1e0) = fVar240;
                          *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                          *(int *)(ray + k * 4 + 0x220) = (int)local_8c8;
                          *(uint *)(ray + k * 4 + 0x240) = uVar81;
                          *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                        }
                        else {
                          pRVar4 = context->user;
                          auVar209._8_4_ = 1;
                          auVar209._0_8_ = 0x100000001;
                          auVar209._12_4_ = 1;
                          auVar209._16_4_ = 1;
                          auVar209._20_4_ = 1;
                          auVar209._24_4_ = 1;
                          auVar209._28_4_ = 1;
                          auVar102 = vpermps_avx2(auVar209,ZEXT1632(auVar86));
                          auVar218._8_4_ = 2;
                          auVar218._0_8_ = 0x200000002;
                          auVar218._12_4_ = 2;
                          auVar218._16_4_ = 2;
                          auVar218._20_4_ = 2;
                          auVar218._24_4_ = 2;
                          auVar218._28_4_ = 2;
                          local_580 = vpermps_avx2(auVar218,ZEXT1632(auVar86));
                          local_5a0[0] = (RTCHitN)auVar102[0];
                          local_5a0[1] = (RTCHitN)auVar102[1];
                          local_5a0[2] = (RTCHitN)auVar102[2];
                          local_5a0[3] = (RTCHitN)auVar102[3];
                          local_5a0[4] = (RTCHitN)auVar102[4];
                          local_5a0[5] = (RTCHitN)auVar102[5];
                          local_5a0[6] = (RTCHitN)auVar102[6];
                          local_5a0[7] = (RTCHitN)auVar102[7];
                          local_5a0[8] = (RTCHitN)auVar102[8];
                          local_5a0[9] = (RTCHitN)auVar102[9];
                          local_5a0[10] = (RTCHitN)auVar102[10];
                          local_5a0[0xb] = (RTCHitN)auVar102[0xb];
                          local_5a0[0xc] = (RTCHitN)auVar102[0xc];
                          local_5a0[0xd] = (RTCHitN)auVar102[0xd];
                          local_5a0[0xe] = (RTCHitN)auVar102[0xe];
                          local_5a0[0xf] = (RTCHitN)auVar102[0xf];
                          local_5a0[0x10] = (RTCHitN)auVar102[0x10];
                          local_5a0[0x11] = (RTCHitN)auVar102[0x11];
                          local_5a0[0x12] = (RTCHitN)auVar102[0x12];
                          local_5a0[0x13] = (RTCHitN)auVar102[0x13];
                          local_5a0[0x14] = (RTCHitN)auVar102[0x14];
                          local_5a0[0x15] = (RTCHitN)auVar102[0x15];
                          local_5a0[0x16] = (RTCHitN)auVar102[0x16];
                          local_5a0[0x17] = (RTCHitN)auVar102[0x17];
                          local_5a0[0x18] = (RTCHitN)auVar102[0x18];
                          local_5a0[0x19] = (RTCHitN)auVar102[0x19];
                          local_5a0[0x1a] = (RTCHitN)auVar102[0x1a];
                          local_5a0[0x1b] = (RTCHitN)auVar102[0x1b];
                          local_5a0[0x1c] = (RTCHitN)auVar102[0x1c];
                          local_5a0[0x1d] = (RTCHitN)auVar102[0x1d];
                          local_5a0[0x1e] = (RTCHitN)auVar102[0x1e];
                          local_5a0[0x1f] = (RTCHitN)auVar102[0x1f];
                          local_560 = uVar251;
                          uStack_55c = uVar251;
                          uStack_558 = uVar251;
                          uStack_554 = uVar251;
                          uStack_550 = uVar251;
                          uStack_54c = uVar251;
                          uStack_548 = uVar251;
                          uStack_544 = uVar251;
                          local_540 = fVar240;
                          fStack_53c = fVar240;
                          fStack_538 = fVar240;
                          fStack_534 = fVar240;
                          fStack_530 = fVar240;
                          fStack_52c = fVar240;
                          fStack_528 = fVar240;
                          fStack_524 = fVar240;
                          local_520 = ZEXT432(0) << 0x20;
                          local_500 = local_620._0_8_;
                          uStack_4f8 = local_620._8_8_;
                          uStack_4f0 = local_620._16_8_;
                          uStack_4e8 = local_620._24_8_;
                          local_4e0 = local_600;
                          auVar102 = vpcmpeqd_avx2(local_600,local_600);
                          local_8e8[1] = auVar102;
                          *local_8e8 = auVar102;
                          local_4c0 = pRVar4->instID[0];
                          uStack_4bc = local_4c0;
                          uStack_4b8 = local_4c0;
                          uStack_4b4 = local_4c0;
                          uStack_4b0 = local_4c0;
                          uStack_4ac = local_4c0;
                          uStack_4a8 = local_4c0;
                          uStack_4a4 = local_4c0;
                          local_4a0 = pRVar4->instPrimID[0];
                          uStack_49c = local_4a0;
                          uStack_498 = local_4a0;
                          uStack_494 = local_4a0;
                          uStack_490 = local_4a0;
                          uStack_48c = local_4a0;
                          uStack_488 = local_4a0;
                          uStack_484 = local_4a0;
                          *(float *)(ray + k * 4 + 0x100) = fVar242;
                          local_840 = local_640._0_8_;
                          uStack_838 = local_640._8_8_;
                          uStack_830 = local_640._16_8_;
                          uStack_828 = local_640._24_8_;
                          local_930.valid = (int *)&local_840;
                          local_930.geometryUserPtr = pGVar3->userPtr;
                          local_930.context = context->user;
                          local_930.hit = local_5a0;
                          local_930.N = 8;
                          local_930.ray = (RTCRayN *)ray;
                          if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar3->intersectionFilterN)(&local_930);
                            auVar258 = ZEXT3264(local_8c0);
                          }
                          auVar65._8_8_ = uStack_838;
                          auVar65._0_8_ = local_840;
                          auVar65._16_8_ = uStack_830;
                          auVar65._24_8_ = uStack_828;
                          if (auVar65 == (undefined1  [32])0x0) {
LAB_01d7b42a:
                            *(float *)(ray + k * 4 + 0x100) = fVar252;
                          }
                          else {
                            p_Var5 = context->args->filter;
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var5)(&local_930);
                              auVar258 = ZEXT3264(local_8c0);
                            }
                            auVar66._8_8_ = uStack_838;
                            auVar66._0_8_ = local_840;
                            auVar66._16_8_ = uStack_830;
                            auVar66._24_8_ = uStack_828;
                            if (auVar66 == (undefined1  [32])0x0) goto LAB_01d7b42a;
                            uVar84 = vptestmd_avx512vl(auVar66,auVar66);
                            iVar56 = *(int *)(local_930.hit + 4);
                            iVar57 = *(int *)(local_930.hit + 8);
                            iVar58 = *(int *)(local_930.hit + 0xc);
                            iVar59 = *(int *)(local_930.hit + 0x10);
                            iVar60 = *(int *)(local_930.hit + 0x14);
                            iVar61 = *(int *)(local_930.hit + 0x18);
                            iVar62 = *(int *)(local_930.hit + 0x1c);
                            bVar79 = (byte)uVar84;
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar12 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_930.ray + 0x180) =
                                 (uint)(bVar79 & 1) * *(int *)local_930.hit |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_930.ray + 0x180);
                            *(uint *)(local_930.ray + 0x184) =
                                 (uint)bVar83 * iVar56 |
                                 (uint)!bVar83 * *(int *)(local_930.ray + 0x184);
                            *(uint *)(local_930.ray + 0x188) =
                                 (uint)bVar7 * iVar57 |
                                 (uint)!bVar7 * *(int *)(local_930.ray + 0x188);
                            *(uint *)(local_930.ray + 0x18c) =
                                 (uint)bVar8 * iVar58 |
                                 (uint)!bVar8 * *(int *)(local_930.ray + 0x18c);
                            *(uint *)(local_930.ray + 400) =
                                 (uint)bVar9 * iVar59 | (uint)!bVar9 * *(int *)(local_930.ray + 400)
                            ;
                            *(uint *)(local_930.ray + 0x194) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x194);
                            *(uint *)(local_930.ray + 0x198) =
                                 (uint)bVar11 * iVar61 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x198);
                            *(uint *)(local_930.ray + 0x19c) =
                                 (uint)bVar12 * iVar62 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x19c);
                            iVar56 = *(int *)(local_930.hit + 0x24);
                            iVar57 = *(int *)(local_930.hit + 0x28);
                            iVar58 = *(int *)(local_930.hit + 0x2c);
                            iVar59 = *(int *)(local_930.hit + 0x30);
                            iVar60 = *(int *)(local_930.hit + 0x34);
                            iVar61 = *(int *)(local_930.hit + 0x38);
                            iVar62 = *(int *)(local_930.hit + 0x3c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar12 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_930.ray + 0x1a0) =
                                 (uint)(bVar79 & 1) * *(int *)(local_930.hit + 0x20) |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_930.ray + 0x1a0);
                            *(uint *)(local_930.ray + 0x1a4) =
                                 (uint)bVar83 * iVar56 |
                                 (uint)!bVar83 * *(int *)(local_930.ray + 0x1a4);
                            *(uint *)(local_930.ray + 0x1a8) =
                                 (uint)bVar7 * iVar57 |
                                 (uint)!bVar7 * *(int *)(local_930.ray + 0x1a8);
                            *(uint *)(local_930.ray + 0x1ac) =
                                 (uint)bVar8 * iVar58 |
                                 (uint)!bVar8 * *(int *)(local_930.ray + 0x1ac);
                            *(uint *)(local_930.ray + 0x1b0) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x1b0);
                            *(uint *)(local_930.ray + 0x1b4) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x1b4);
                            *(uint *)(local_930.ray + 0x1b8) =
                                 (uint)bVar11 * iVar61 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x1b8);
                            *(uint *)(local_930.ray + 0x1bc) =
                                 (uint)bVar12 * iVar62 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x1bc);
                            iVar56 = *(int *)(local_930.hit + 0x44);
                            iVar57 = *(int *)(local_930.hit + 0x48);
                            iVar58 = *(int *)(local_930.hit + 0x4c);
                            iVar59 = *(int *)(local_930.hit + 0x50);
                            iVar60 = *(int *)(local_930.hit + 0x54);
                            iVar61 = *(int *)(local_930.hit + 0x58);
                            iVar62 = *(int *)(local_930.hit + 0x5c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar12 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_930.ray + 0x1c0) =
                                 (uint)(bVar79 & 1) * *(int *)(local_930.hit + 0x40) |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_930.ray + 0x1c0);
                            *(uint *)(local_930.ray + 0x1c4) =
                                 (uint)bVar83 * iVar56 |
                                 (uint)!bVar83 * *(int *)(local_930.ray + 0x1c4);
                            *(uint *)(local_930.ray + 0x1c8) =
                                 (uint)bVar7 * iVar57 |
                                 (uint)!bVar7 * *(int *)(local_930.ray + 0x1c8);
                            *(uint *)(local_930.ray + 0x1cc) =
                                 (uint)bVar8 * iVar58 |
                                 (uint)!bVar8 * *(int *)(local_930.ray + 0x1cc);
                            *(uint *)(local_930.ray + 0x1d0) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x1d0);
                            *(uint *)(local_930.ray + 0x1d4) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x1d4);
                            *(uint *)(local_930.ray + 0x1d8) =
                                 (uint)bVar11 * iVar61 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x1d8);
                            *(uint *)(local_930.ray + 0x1dc) =
                                 (uint)bVar12 * iVar62 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x1dc);
                            iVar56 = *(int *)(local_930.hit + 100);
                            iVar57 = *(int *)(local_930.hit + 0x68);
                            iVar58 = *(int *)(local_930.hit + 0x6c);
                            iVar59 = *(int *)(local_930.hit + 0x70);
                            iVar60 = *(int *)(local_930.hit + 0x74);
                            iVar61 = *(int *)(local_930.hit + 0x78);
                            iVar62 = *(int *)(local_930.hit + 0x7c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar12 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_930.ray + 0x1e0) =
                                 (uint)(bVar79 & 1) * *(int *)(local_930.hit + 0x60) |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_930.ray + 0x1e0);
                            *(uint *)(local_930.ray + 0x1e4) =
                                 (uint)bVar83 * iVar56 |
                                 (uint)!bVar83 * *(int *)(local_930.ray + 0x1e4);
                            *(uint *)(local_930.ray + 0x1e8) =
                                 (uint)bVar7 * iVar57 |
                                 (uint)!bVar7 * *(int *)(local_930.ray + 0x1e8);
                            *(uint *)(local_930.ray + 0x1ec) =
                                 (uint)bVar8 * iVar58 |
                                 (uint)!bVar8 * *(int *)(local_930.ray + 0x1ec);
                            *(uint *)(local_930.ray + 0x1f0) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x1f0);
                            *(uint *)(local_930.ray + 500) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 500);
                            *(uint *)(local_930.ray + 0x1f8) =
                                 (uint)bVar11 * iVar61 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x1f8);
                            *(uint *)(local_930.ray + 0x1fc) =
                                 (uint)bVar12 * iVar62 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x1fc);
                            iVar56 = *(int *)(local_930.hit + 0x84);
                            iVar57 = *(int *)(local_930.hit + 0x88);
                            iVar58 = *(int *)(local_930.hit + 0x8c);
                            iVar59 = *(int *)(local_930.hit + 0x90);
                            iVar60 = *(int *)(local_930.hit + 0x94);
                            iVar61 = *(int *)(local_930.hit + 0x98);
                            iVar62 = *(int *)(local_930.hit + 0x9c);
                            bVar83 = (bool)((byte)(uVar84 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar84 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar84 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar84 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar84 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar84 >> 6) & 1);
                            bVar12 = SUB81(uVar84 >> 7,0);
                            *(uint *)(local_930.ray + 0x200) =
                                 (uint)(bVar79 & 1) * *(int *)(local_930.hit + 0x80) |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_930.ray + 0x200);
                            *(uint *)(local_930.ray + 0x204) =
                                 (uint)bVar83 * iVar56 |
                                 (uint)!bVar83 * *(int *)(local_930.ray + 0x204);
                            *(uint *)(local_930.ray + 0x208) =
                                 (uint)bVar7 * iVar57 |
                                 (uint)!bVar7 * *(int *)(local_930.ray + 0x208);
                            *(uint *)(local_930.ray + 0x20c) =
                                 (uint)bVar8 * iVar58 |
                                 (uint)!bVar8 * *(int *)(local_930.ray + 0x20c);
                            *(uint *)(local_930.ray + 0x210) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x210);
                            *(uint *)(local_930.ray + 0x214) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x214);
                            *(uint *)(local_930.ray + 0x218) =
                                 (uint)bVar11 * iVar61 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x218);
                            *(uint *)(local_930.ray + 0x21c) =
                                 (uint)bVar12 * iVar62 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x21c);
                            auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0xa0));
                            *(undefined1 (*) [32])(local_930.ray + 0x220) = auVar102;
                            auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0xc0));
                            *(undefined1 (*) [32])(local_930.ray + 0x240) = auVar102;
                            auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0xe0));
                            *(undefined1 (*) [32])(local_930.ray + 0x260) = auVar102;
                            auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0x100));
                            *(undefined1 (*) [32])(local_930.ray + 0x280) = auVar102;
                          }
                          auVar230 = ZEXT464((uint)fVar252);
                        }
                      }
                    }
                  }
                }
                bVar83 = lVar82 != 0;
                lVar82 = lVar82 + -1;
              } while ((!bVar6) && (bVar83));
              auVar68._4_4_ = fStack_69c;
              auVar68._0_4_ = local_6a0;
              auVar68._8_4_ = fStack_698;
              auVar68._12_4_ = fStack_694;
              auVar68._16_4_ = fStack_690;
              auVar68._20_4_ = fStack_68c;
              auVar68._24_4_ = fStack_688;
              auVar68._28_4_ = fStack_684;
              uVar251 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar34._4_4_ = uVar251;
              auVar34._0_4_ = uVar251;
              auVar34._8_4_ = uVar251;
              auVar34._12_4_ = uVar251;
              auVar34._16_4_ = uVar251;
              auVar34._20_4_ = uVar251;
              auVar34._24_4_ = uVar251;
              auVar34._28_4_ = uVar251;
              uVar15 = vcmpps_avx512vl(auVar68,auVar34,2);
              bVar80 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar80 & (byte)uVar15;
            } while (bVar80 != 0);
          }
          uVar17 = vpcmpd_avx512vl(local_5e0,_local_6c0,1);
          uVar16 = vpcmpd_avx512vl(local_5e0,local_440,1);
          auVar188._0_4_ = (float)local_700._0_4_ + (float)local_1c0._0_4_;
          auVar188._4_4_ = (float)local_700._4_4_ + (float)local_1c0._4_4_;
          auVar188._8_4_ = fStack_6f8 + fStack_1b8;
          auVar188._12_4_ = fStack_6f4 + fStack_1b4;
          auVar188._16_4_ = fStack_6f0 + fStack_1b0;
          auVar188._20_4_ = fStack_6ec + fStack_1ac;
          auVar188._24_4_ = fStack_6e8 + fStack_1a8;
          auVar188._28_4_ = fStack_6e4 + fStack_1a4;
          uVar251 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar210._4_4_ = uVar251;
          auVar210._0_4_ = uVar251;
          auVar210._8_4_ = uVar251;
          auVar210._12_4_ = uVar251;
          auVar210._16_4_ = uVar251;
          auVar210._20_4_ = uVar251;
          auVar210._24_4_ = uVar251;
          auVar210._28_4_ = uVar251;
          uVar15 = vcmpps_avx512vl(auVar188,auVar210,2);
          bVar77 = bVar77 & (byte)uVar16 & (byte)uVar15;
          auVar219._0_4_ = (float)local_700._0_4_ + (float)local_480._0_4_;
          auVar219._4_4_ = (float)local_700._4_4_ + (float)local_480._4_4_;
          auVar219._8_4_ = fStack_6f8 + fStack_478;
          auVar219._12_4_ = fStack_6f4 + fStack_474;
          auVar219._16_4_ = fStack_6f0 + fStack_470;
          auVar219._20_4_ = fStack_6ec + fStack_46c;
          auVar219._24_4_ = fStack_6e8 + fStack_468;
          auVar219._28_4_ = fStack_6e4 + fStack_464;
          uVar15 = vcmpps_avx512vl(auVar219,auVar210,2);
          bVar73 = bVar73 & (byte)uVar17 & (byte)uVar15 | bVar77;
          prim = local_8e0;
          if (bVar73 == 0) {
            auVar220 = ZEXT3264(_DAT_02020f20);
          }
          else {
            uVar84 = local_8d8 & 0xffffffff;
            abStack_180[uVar84 * 0x60] = bVar73;
            bVar6 = (bool)(bVar77 >> 1 & 1);
            bVar83 = (bool)(bVar77 >> 2 & 1);
            bVar7 = (bool)(bVar77 >> 3 & 1);
            bVar8 = (bool)(bVar77 >> 4 & 1);
            bVar9 = (bool)(bVar77 >> 5 & 1);
            auStack_160[uVar84 * 0x18] =
                 (uint)(bVar77 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar77 & 1) * local_480._0_4_;
            auStack_160[uVar84 * 0x18 + 1] =
                 (uint)bVar6 * local_1c0._4_4_ | (uint)!bVar6 * local_480._4_4_;
            auStack_160[uVar84 * 0x18 + 2] =
                 (uint)bVar83 * (int)fStack_1b8 | (uint)!bVar83 * (int)fStack_478;
            auStack_160[uVar84 * 0x18 + 3] =
                 (uint)bVar7 * (int)fStack_1b4 | (uint)!bVar7 * (int)fStack_474;
            auStack_160[uVar84 * 0x18 + 4] =
                 (uint)bVar8 * (int)fStack_1b0 | (uint)!bVar8 * (int)fStack_470;
            auStack_160[uVar84 * 0x18 + 5] =
                 (uint)bVar9 * (int)fStack_1ac | (uint)!bVar9 * (int)fStack_46c;
            auStack_160[uVar84 * 0x18 + 6] =
                 (uint)(bVar77 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar77 >> 6) * (int)fStack_468;
            (&fStack_144)[uVar84 * 0x18] = fStack_464;
            uVar15 = vmovlps_avx(local_900);
            (&uStack_140)[uVar84 * 0xc] = uVar15;
            afStack_138[uVar84 * 0x18] = (float)((int)local_7a8 + 1);
            local_8d8 = (ulong)((int)local_8d8 + 1);
            auVar220 = ZEXT3264(_DAT_02020f20);
          }
        }
      }
    }
    auVar211 = ZEXT1664(local_900);
    local_8d8 = local_8d8 & 0xffffffff;
    do {
      if ((int)local_8d8 == 0) {
        uVar251 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar36._4_4_ = uVar251;
        auVar36._0_4_ = uVar251;
        auVar36._8_4_ = uVar251;
        auVar36._12_4_ = uVar251;
        auVar36._16_4_ = uVar251;
        auVar36._20_4_ = uVar251;
        auVar36._24_4_ = uVar251;
        auVar36._28_4_ = uVar251;
        uVar15 = vcmpps_avx512vl(local_420,auVar36,2);
        uVar81 = (uint)uVar15 & (uint)local_8d0 - 1 & (uint)local_8d0;
        local_8d0 = (ulong)uVar81;
        if (uVar81 == 0) {
          return;
        }
        goto LAB_01d7905b;
      }
      uVar84 = (ulong)((int)local_8d8 - 1);
      auVar102 = *(undefined1 (*) [32])(auStack_160 + uVar84 * 0x18);
      auVar189._0_4_ = auVar102._0_4_ + (float)local_700._0_4_;
      auVar189._4_4_ = auVar102._4_4_ + (float)local_700._4_4_;
      auVar189._8_4_ = auVar102._8_4_ + fStack_6f8;
      auVar189._12_4_ = auVar102._12_4_ + fStack_6f4;
      auVar189._16_4_ = auVar102._16_4_ + fStack_6f0;
      auVar189._20_4_ = auVar102._20_4_ + fStack_6ec;
      auVar189._24_4_ = auVar102._24_4_ + fStack_6e8;
      auVar189._28_4_ = auVar102._28_4_ + fStack_6e4;
      uVar251 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar35._4_4_ = uVar251;
      auVar35._0_4_ = uVar251;
      auVar35._8_4_ = uVar251;
      auVar35._12_4_ = uVar251;
      auVar35._16_4_ = uVar251;
      auVar35._20_4_ = uVar251;
      auVar35._24_4_ = uVar251;
      auVar35._28_4_ = uVar251;
      uVar15 = vcmpps_avx512vl(auVar189,auVar35,2);
      uVar85 = (uint)uVar15 & (uint)abStack_180[uVar84 * 0x60];
      bVar73 = (byte)uVar85;
      if (uVar85 != 0) {
        auVar190._8_4_ = 0x7f800000;
        auVar190._0_8_ = 0x7f8000007f800000;
        auVar190._12_4_ = 0x7f800000;
        auVar190._16_4_ = 0x7f800000;
        auVar190._20_4_ = 0x7f800000;
        auVar190._24_4_ = 0x7f800000;
        auVar190._28_4_ = 0x7f800000;
        auVar103 = vblendmps_avx512vl(auVar190,auVar102);
        auVar143._0_4_ =
             (uint)(bVar73 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar73 & 1) * (int)auVar102._0_4_;
        bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar143._4_4_ = (uint)bVar6 * auVar103._4_4_ | (uint)!bVar6 * (int)auVar102._4_4_;
        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar143._8_4_ = (uint)bVar6 * auVar103._8_4_ | (uint)!bVar6 * (int)auVar102._8_4_;
        bVar6 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar143._12_4_ = (uint)bVar6 * auVar103._12_4_ | (uint)!bVar6 * (int)auVar102._12_4_;
        bVar6 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar143._16_4_ = (uint)bVar6 * auVar103._16_4_ | (uint)!bVar6 * (int)auVar102._16_4_;
        bVar6 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar143._20_4_ = (uint)bVar6 * auVar103._20_4_ | (uint)!bVar6 * (int)auVar102._20_4_;
        bVar6 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar143._24_4_ = (uint)bVar6 * auVar103._24_4_ | (uint)!bVar6 * (int)auVar102._24_4_;
        auVar143._28_4_ =
             (uVar85 >> 7) * auVar103._28_4_ | (uint)!SUB41(uVar85 >> 7,0) * (int)auVar102._28_4_;
        auVar102 = vshufps_avx(auVar143,auVar143,0xb1);
        auVar102 = vminps_avx(auVar143,auVar102);
        auVar103 = vshufpd_avx(auVar102,auVar102,5);
        auVar102 = vminps_avx(auVar102,auVar103);
        auVar103 = vpermpd_avx2(auVar102,0x4e);
        auVar102 = vminps_avx(auVar102,auVar103);
        uVar15 = vcmpps_avx512vl(auVar143,auVar102,0);
        bVar80 = (byte)uVar15 & bVar73;
        if (bVar80 != 0) {
          uVar85 = (uint)bVar80;
        }
        fVar151 = afStack_138[uVar84 * 0x18 + -1];
        uVar144 = 0;
        for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
          uVar144 = uVar144 + 1;
        }
        local_7a8 = (ulong)(uint)afStack_138[uVar84 * 0x18];
        bVar80 = ~('\x01' << ((byte)uVar144 & 0x1f)) & bVar73;
        abStack_180[uVar84 * 0x60] = bVar80;
        uVar76 = uVar84;
        if (bVar80 != 0) {
          uVar76 = local_8d8;
        }
        fVar240 = *(float *)(&uStack_140 + uVar84 * 0xc);
        auVar191._4_4_ = fVar240;
        auVar191._0_4_ = fVar240;
        auVar191._8_4_ = fVar240;
        auVar191._12_4_ = fVar240;
        auVar191._16_4_ = fVar240;
        auVar191._20_4_ = fVar240;
        auVar191._24_4_ = fVar240;
        auVar191._28_4_ = fVar240;
        fVar151 = fVar151 - fVar240;
        auVar170._4_4_ = fVar151;
        auVar170._0_4_ = fVar151;
        auVar170._8_4_ = fVar151;
        auVar170._12_4_ = fVar151;
        auVar170._16_4_ = fVar151;
        auVar170._20_4_ = fVar151;
        auVar170._24_4_ = fVar151;
        auVar170._28_4_ = fVar151;
        auVar86 = vfmadd132ps_fma(auVar170,auVar191,auVar220._0_32_);
        auVar102 = ZEXT1632(auVar86);
        local_5a0[0] = (RTCHitN)auVar102[0];
        local_5a0[1] = (RTCHitN)auVar102[1];
        local_5a0[2] = (RTCHitN)auVar102[2];
        local_5a0[3] = (RTCHitN)auVar102[3];
        local_5a0[4] = (RTCHitN)auVar102[4];
        local_5a0[5] = (RTCHitN)auVar102[5];
        local_5a0[6] = (RTCHitN)auVar102[6];
        local_5a0[7] = (RTCHitN)auVar102[7];
        local_5a0[8] = (RTCHitN)auVar102[8];
        local_5a0[9] = (RTCHitN)auVar102[9];
        local_5a0[10] = (RTCHitN)auVar102[10];
        local_5a0[0xb] = (RTCHitN)auVar102[0xb];
        local_5a0[0xc] = (RTCHitN)auVar102[0xc];
        local_5a0[0xd] = (RTCHitN)auVar102[0xd];
        local_5a0[0xe] = (RTCHitN)auVar102[0xe];
        local_5a0[0xf] = (RTCHitN)auVar102[0xf];
        local_5a0[0x10] = (RTCHitN)auVar102[0x10];
        local_5a0[0x11] = (RTCHitN)auVar102[0x11];
        local_5a0[0x12] = (RTCHitN)auVar102[0x12];
        local_5a0[0x13] = (RTCHitN)auVar102[0x13];
        local_5a0[0x14] = (RTCHitN)auVar102[0x14];
        local_5a0[0x15] = (RTCHitN)auVar102[0x15];
        local_5a0[0x16] = (RTCHitN)auVar102[0x16];
        local_5a0[0x17] = (RTCHitN)auVar102[0x17];
        local_5a0[0x18] = (RTCHitN)auVar102[0x18];
        local_5a0[0x19] = (RTCHitN)auVar102[0x19];
        local_5a0[0x1a] = (RTCHitN)auVar102[0x1a];
        local_5a0[0x1b] = (RTCHitN)auVar102[0x1b];
        local_5a0[0x1c] = (RTCHitN)auVar102[0x1c];
        local_5a0[0x1d] = (RTCHitN)auVar102[0x1d];
        local_5a0[0x1e] = (RTCHitN)auVar102[0x1e];
        local_5a0[0x1f] = (RTCHitN)auVar102[0x1f];
        auVar211 = ZEXT864(*(ulong *)(local_5a0 + (ulong)uVar144 * 4));
        uVar84 = uVar76;
      }
      local_8d8 = uVar84;
    } while (bVar73 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }